

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  uint uVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  RTCRayQueryContext *pRVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  bool bVar52;
  undefined1 auVar53 [12];
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  uint uVar93;
  int iVar94;
  uint uVar95;
  uint uVar96;
  ulong uVar97;
  undefined1 auVar98 [8];
  ulong uVar99;
  undefined4 uVar100;
  ulong uVar101;
  long lVar102;
  bool bVar103;
  float fVar104;
  float fVar131;
  float fVar133;
  vint4 bi_2;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar105;
  undefined1 auVar122 [32];
  float fVar132;
  float fVar134;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar170;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar175 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  vint4 ai_2;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar212;
  float fVar225;
  float fVar226;
  vint4 ai;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar228;
  undefined1 auVar221 [32];
  float fVar227;
  float fVar229;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  vint4 bi;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar244 [16];
  undefined1 auVar243 [16];
  undefined1 auVar249 [32];
  undefined1 auVar245 [16];
  float fVar251;
  float fVar252;
  undefined1 auVar250 [64];
  float fVar264;
  vint4 ai_1;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  float fVar265;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar266;
  float fVar276;
  float fVar277;
  undefined1 auVar267 [16];
  float fVar278;
  float fVar281;
  undefined1 auVar270 [28];
  undefined1 auVar269 [16];
  float fVar279;
  float fVar280;
  undefined1 auVar275 [64];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar286;
  undefined1 auVar284 [32];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [64];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar298;
  float fVar299;
  undefined1 auVar297 [64];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 auVar308 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  float P_err;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined1 local_cc0 [32];
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  RTCFilterFunctionNArguments local_bb0;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined1 auStack_b10 [16];
  undefined1 (*local_ae8) [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [16];
  Primitive *local_9b0;
  ulong local_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined4 local_960;
  undefined4 uStack_95c;
  undefined4 uStack_958;
  undefined4 uStack_954;
  undefined4 uStack_950;
  undefined4 uStack_94c;
  undefined4 uStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined4 uStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined4 uStack_7c4;
  ulong local_7c0;
  undefined1 auStack_7b8 [24];
  uint local_7a0;
  uint uStack_79c;
  uint uStack_798;
  uint uStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  uint uStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  uint local_600;
  uint uStack_5fc;
  uint uStack_5f8;
  uint uStack_5f4;
  uint uStack_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  uint local_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  uint uStack_5d0;
  uint uStack_5cc;
  uint uStack_5c8;
  uint uStack_5c4;
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  RTCHitN local_3e0 [32];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar185 [32];
  undefined1 auVar188 [32];
  undefined1 auVar268 [16];
  undefined1 auVar285 [64];
  
  PVar2 = prim[1];
  uVar99 = (ulong)(byte)PVar2;
  fVar104 = *(float *)(prim + uVar99 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar99 * 0x19 + 6));
  auVar106._0_4_ = fVar104 * auVar8._0_4_;
  auVar106._4_4_ = fVar104 * auVar8._4_4_;
  auVar106._8_4_ = fVar104 * auVar8._8_4_;
  auVar106._12_4_ = fVar104 * auVar8._12_4_;
  auVar230._0_4_ = fVar104 * auVar9._0_4_;
  auVar230._4_4_ = fVar104 * auVar9._4_4_;
  auVar230._8_4_ = fVar104 * auVar9._8_4_;
  auVar230._12_4_ = fVar104 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 6 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar99 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar101 = (ulong)(uint)((int)(uVar99 * 9) * 2);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 + uVar99 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar101 = (ulong)(uint)((int)(uVar99 * 5) << 2);
  auVar115 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 + 6)));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar305._4_4_ = auVar230._0_4_;
  auVar305._0_4_ = auVar230._0_4_;
  auVar305._8_4_ = auVar230._0_4_;
  auVar305._12_4_ = auVar230._0_4_;
  auVar139 = vshufps_avx(auVar230,auVar230,0x55);
  auVar107 = vshufps_avx(auVar230,auVar230,0xaa);
  fVar104 = auVar107._0_4_;
  auVar287._0_4_ = fVar104 * auVar10._0_4_;
  fVar131 = auVar107._4_4_;
  auVar287._4_4_ = fVar131 * auVar10._4_4_;
  fVar212 = auVar107._8_4_;
  auVar287._8_4_ = fVar212 * auVar10._8_4_;
  fVar225 = auVar107._12_4_;
  auVar287._12_4_ = fVar225 * auVar10._12_4_;
  auVar282._0_4_ = auVar13._0_4_ * fVar104;
  auVar282._4_4_ = auVar13._4_4_ * fVar131;
  auVar282._8_4_ = auVar13._8_4_ * fVar212;
  auVar282._12_4_ = auVar13._12_4_ * fVar225;
  auVar253._0_4_ = auVar115._0_4_ * fVar104;
  auVar253._4_4_ = auVar115._4_4_ * fVar131;
  auVar253._8_4_ = auVar115._8_4_ * fVar212;
  auVar253._12_4_ = auVar115._12_4_ * fVar225;
  auVar107 = vfmadd231ps_fma(auVar287,auVar139,auVar9);
  auVar140 = vfmadd231ps_fma(auVar282,auVar139,auVar12);
  auVar139 = vfmadd231ps_fma(auVar253,auVar108,auVar139);
  auVar148 = vfmadd231ps_fma(auVar107,auVar305,auVar8);
  auVar140 = vfmadd231ps_fma(auVar140,auVar305,auVar11);
  auVar214 = vfmadd231ps_fma(auVar139,auVar109,auVar305);
  auVar306._4_4_ = auVar106._0_4_;
  auVar306._0_4_ = auVar106._0_4_;
  auVar306._8_4_ = auVar106._0_4_;
  auVar306._12_4_ = auVar106._0_4_;
  auVar139 = vshufps_avx(auVar106,auVar106,0x55);
  auVar107 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar104 = auVar107._0_4_;
  auVar231._0_4_ = fVar104 * auVar10._0_4_;
  fVar131 = auVar107._4_4_;
  auVar231._4_4_ = fVar131 * auVar10._4_4_;
  fVar212 = auVar107._8_4_;
  auVar231._8_4_ = fVar212 * auVar10._8_4_;
  fVar225 = auVar107._12_4_;
  auVar231._12_4_ = fVar225 * auVar10._12_4_;
  auVar138._0_4_ = auVar13._0_4_ * fVar104;
  auVar138._4_4_ = auVar13._4_4_ * fVar131;
  auVar138._8_4_ = auVar13._8_4_ * fVar212;
  auVar138._12_4_ = auVar13._12_4_ * fVar225;
  auVar107._0_4_ = auVar115._0_4_ * fVar104;
  auVar107._4_4_ = auVar115._4_4_ * fVar131;
  auVar107._8_4_ = auVar115._8_4_ * fVar212;
  auVar107._12_4_ = auVar115._12_4_ * fVar225;
  auVar9 = vfmadd231ps_fma(auVar231,auVar139,auVar9);
  auVar10 = vfmadd231ps_fma(auVar138,auVar139,auVar12);
  auVar12 = vfmadd231ps_fma(auVar107,auVar139,auVar108);
  auVar13 = vfmadd231ps_fma(auVar9,auVar306,auVar8);
  auVar108 = vfmadd231ps_fma(auVar10,auVar306,auVar11);
  auVar115 = vfmadd231ps_fma(auVar12,auVar306,auVar109);
  local_a60._8_4_ = 0x7fffffff;
  local_a60._0_8_ = 0x7fffffff7fffffff;
  local_a60._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar148,local_a60);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar213,1);
  auVar9 = vblendvps_avx(auVar148,auVar213,auVar8);
  auVar8 = vandps_avx(auVar140,local_a60);
  auVar8 = vcmpps_avx(auVar8,auVar213,1);
  auVar10 = vblendvps_avx(auVar140,auVar213,auVar8);
  auVar8 = vandps_avx(auVar214,local_a60);
  auVar8 = vcmpps_avx(auVar8,auVar213,1);
  auVar8 = vblendvps_avx(auVar214,auVar213,auVar8);
  auVar11 = vrcpps_avx(auVar9);
  auVar243._8_4_ = 0x3f800000;
  auVar243._0_8_ = &DAT_3f8000003f800000;
  auVar243._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar11,auVar243);
  auVar11 = vfmadd132ps_fma(auVar9,auVar11,auVar11);
  auVar9 = vrcpps_avx(auVar10);
  auVar10 = vfnmadd213ps_fma(auVar10,auVar9,auVar243);
  auVar12 = vfmadd132ps_fma(auVar10,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar243);
  auVar109 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar99 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar214._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar214._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar214._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar214._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar99 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar232._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar232._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar232._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar232._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar140._1_3_ = 0;
  auVar140[0] = PVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar99 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar108);
  auVar254._0_4_ = auVar8._0_4_ * auVar12._0_4_;
  auVar254._4_4_ = auVar8._4_4_ * auVar12._4_4_;
  auVar254._8_4_ = auVar8._8_4_ * auVar12._8_4_;
  auVar254._12_4_ = auVar8._12_4_ * auVar12._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar9);
  auVar8 = vsubps_avx(auVar8,auVar108);
  auVar139._0_4_ = auVar12._0_4_ * auVar8._0_4_;
  auVar139._4_4_ = auVar12._4_4_ * auVar8._4_4_;
  auVar139._8_4_ = auVar12._8_4_ * auVar8._8_4_;
  auVar139._12_4_ = auVar12._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar101 + uVar99 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar115);
  auVar148._0_4_ = auVar109._0_4_ * auVar8._0_4_;
  auVar148._4_4_ = auVar109._4_4_ * auVar8._4_4_;
  auVar148._8_4_ = auVar109._8_4_ * auVar8._8_4_;
  auVar148._12_4_ = auVar109._12_4_ * auVar8._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar99 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar13);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar115);
  auVar108._0_4_ = auVar109._0_4_ * auVar8._0_4_;
  auVar108._4_4_ = auVar109._4_4_ * auVar8._4_4_;
  auVar108._8_4_ = auVar109._8_4_ * auVar8._8_4_;
  auVar108._12_4_ = auVar109._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar214,auVar232);
  auVar9 = vpminsd_avx(auVar254,auVar139);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar148,auVar108);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar267._4_4_ = uVar100;
  auVar267._0_4_ = uVar100;
  auVar267._8_4_ = uVar100;
  auVar267._12_4_ = uVar100;
  auVar9 = vmaxps_avx(auVar9,auVar267);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_650._0_4_ = auVar8._0_4_ * 0.99999964;
  local_650._4_4_ = auVar8._4_4_ * 0.99999964;
  local_650._8_4_ = auVar8._8_4_ * 0.99999964;
  local_650._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar214,auVar232);
  auVar9 = vpmaxsd_avx(auVar254,auVar139);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar148,auVar108);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar115._4_4_ = uVar100;
  auVar115._0_4_ = uVar100;
  auVar115._8_4_ = uVar100;
  auVar115._12_4_ = uVar100;
  auVar9 = vminps_avx(auVar9,auVar115);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar109._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar109._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar109._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar109._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar140[4] = PVar2;
  auVar140._5_3_ = 0;
  auVar140[8] = PVar2;
  auVar140._9_3_ = 0;
  auVar140[0xc] = PVar2;
  auVar140._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar140,_DAT_01ff0cf0);
  auVar8 = vcmpps_avx(local_650,auVar109,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar93 = vmovmskps_avx(auVar8);
  if (uVar93 == 0) {
    return;
  }
  uVar93 = uVar93 & 0xff;
  auVar120._16_16_ = mm_lookupmask_ps._240_16_;
  auVar120._0_16_ = mm_lookupmask_ps._240_16_;
  local_240 = vblendps_avx(auVar120,ZEXT832(0) << 0x20,0x80);
  local_ae8 = (undefined1 (*) [32])&local_300;
  iVar94 = 1 << ((uint)k & 0x1f);
  auVar121._4_4_ = iVar94;
  auVar121._0_4_ = iVar94;
  auVar121._8_4_ = iVar94;
  auVar121._12_4_ = iVar94;
  auVar121._16_4_ = iVar94;
  auVar121._20_4_ = iVar94;
  auVar121._24_4_ = iVar94;
  auVar121._28_4_ = iVar94;
  auVar125 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar120 = vpand_avx2(auVar121,auVar125);
  local_640 = vpcmpeqd_avx2(auVar120,auVar125);
  local_960 = 0x7fffffff;
  uStack_95c = 0x7fffffff;
  uStack_958 = 0x7fffffff;
  uStack_954 = 0x7fffffff;
  uStack_950 = 0x7fffffff;
  uStack_94c = 0x7fffffff;
  uStack_948 = 0x7fffffff;
  uStack_944 = 0x7fffffff;
  local_7a0 = 0x80000000;
  uStack_79c = 0x80000000;
  uStack_798 = 0x80000000;
  uStack_794 = 0x80000000;
  fStack_790 = -0.0;
  fStack_78c = -0.0;
  fStack_788 = -0.0;
  uStack_784 = 0x80000000;
  local_9b0 = prim;
LAB_0170722b:
  lVar102 = 0;
  local_9a8 = (ulong)uVar93;
  for (uVar101 = local_9a8; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
    lVar102 = lVar102 + 1;
  }
  uVar93 = *(uint *)(local_9b0 + 2);
  uVar3 = *(uint *)(local_9b0 + lVar102 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar93].ptr;
  uVar101 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                            pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)uVar3);
  p_Var6 = pGVar5[1].intersectionFilterN;
  lVar102 = *(long *)&pGVar5[1].time_range.upper;
  auVar8 = *(undefined1 (*) [16])(lVar102 + (long)p_Var6 * uVar101);
  auVar9 = *(undefined1 (*) [16])(lVar102 + (uVar101 + 1) * (long)p_Var6);
  auVar10 = *(undefined1 (*) [16])(lVar102 + (uVar101 + 2) * (long)p_Var6);
  local_9a8 = local_9a8 - 1 & local_9a8;
  auVar11 = *(undefined1 (*) [16])(lVar102 + (uVar101 + 3) * (long)p_Var6);
  if (local_9a8 != 0) {
    uVar99 = local_9a8 - 1 & local_9a8;
    for (uVar101 = local_9a8; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
    }
    if (uVar99 != 0) {
      for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar13 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar255._4_4_ = uVar100;
  auVar255._0_4_ = uVar100;
  auVar255._8_4_ = uVar100;
  auVar255._12_4_ = uVar100;
  fStack_8b0 = (float)uVar100;
  _local_8c0 = auVar255;
  fStack_8ac = (float)uVar100;
  fStack_8a8 = (float)uVar100;
  register0x0000141c = uVar100;
  uVar100 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar268._4_4_ = uVar100;
  auVar268._0_4_ = uVar100;
  auVar268._8_4_ = uVar100;
  auVar268._12_4_ = uVar100;
  fStack_8d0 = (float)uVar100;
  _local_8e0 = auVar268;
  fStack_8cc = (float)uVar100;
  fStack_8c8 = (float)uVar100;
  register0x0000145c = uVar100;
  auVar275 = ZEXT3264(_local_8e0);
  auVar12 = vunpcklps_avx(auVar255,auVar268);
  fVar104 = *(float *)(ray + k * 4 + 0xc0);
  auVar283._4_4_ = fVar104;
  auVar283._0_4_ = fVar104;
  auVar283._8_4_ = fVar104;
  auVar283._12_4_ = fVar104;
  fStack_930 = fVar104;
  _local_940 = auVar283;
  fStack_92c = fVar104;
  fStack_928 = fVar104;
  uStack_924 = fVar104;
  auVar285 = ZEXT3264(_local_940);
  local_a50 = vinsertps_avx(auVar12,auVar283,0x28);
  auVar291 = ZEXT1664(local_a50);
  auVar233._0_4_ = (auVar8._0_4_ + auVar9._0_4_ + auVar10._0_4_ + auVar11._0_4_) * 0.25;
  auVar233._4_4_ = (auVar8._4_4_ + auVar9._4_4_ + auVar10._4_4_ + auVar11._4_4_) * 0.25;
  auVar233._8_4_ = (auVar8._8_4_ + auVar9._8_4_ + auVar10._8_4_ + auVar11._8_4_) * 0.25;
  auVar233._12_4_ = (auVar8._12_4_ + auVar9._12_4_ + auVar10._12_4_ + auVar11._12_4_) * 0.25;
  auVar12 = vsubps_avx(auVar233,auVar13);
  auVar12 = vdpps_avx(auVar12,local_a50,0x7f);
  local_a70 = vdpps_avx(local_a50,local_a50,0x7f);
  auVar297 = ZEXT1664(local_a70);
  auVar109 = vrcpss_avx(local_a70,local_a70);
  auVar108 = vfnmadd213ss_fma(auVar109,local_a70,ZEXT416(0x40000000));
  auVar250 = ZEXT1664(auVar108);
  local_260 = auVar12._0_4_ * auVar109._0_4_ * auVar108._0_4_;
  auVar240._4_4_ = local_260;
  auVar240._0_4_ = local_260;
  auVar240._8_4_ = local_260;
  auVar240._12_4_ = local_260;
  fStack_870 = local_260;
  _local_880 = auVar240;
  fStack_86c = local_260;
  fStack_868 = local_260;
  fStack_864 = local_260;
  auVar12 = vfmadd231ps_fma(auVar13,local_a50,auVar240);
  auVar12 = vblendps_avx(auVar12,_DAT_01feba10,8);
  auVar13 = vsubps_avx(auVar8,auVar12);
  auVar10 = vsubps_avx(auVar10,auVar12);
  auVar109 = vsubps_avx(auVar9,auVar12);
  auVar11 = vsubps_avx(auVar11,auVar12);
  auVar8 = vmovshdup_avx(auVar13);
  local_440 = auVar8._0_8_;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  auVar8 = vshufps_avx(auVar13,auVar13,0xaa);
  local_1a0 = auVar8._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar8 = vshufps_avx(auVar13,auVar13,0xff);
  local_460 = auVar8._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar8 = vmovshdup_avx(auVar109);
  local_480 = auVar8._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar8 = vshufps_avx(auVar109,auVar109,0xaa);
  local_1c0 = auVar8._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar8 = vshufps_avx(auVar109,auVar109,0xff);
  local_4a0 = auVar8._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar8 = vmovshdup_avx(auVar10);
  local_1e0 = auVar8._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar8 = vshufps_avx(auVar10,auVar10,0xaa);
  local_200 = auVar8._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar8 = vshufps_avx(auVar10,auVar10,0xff);
  local_4c0 = auVar8._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar8 = vmovshdup_avx(auVar11);
  local_4e0 = auVar8._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar8 = vshufps_avx(auVar11,auVar11,0xaa);
  local_500 = auVar8._0_8_;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  auVar8 = vshufps_avx(auVar11,auVar11,0xff);
  local_520 = auVar8._0_8_;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  auVar8 = vfmadd231ps_fma(ZEXT432((uint)(fVar104 * fVar104)),_local_8e0,_local_8e0);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_8c0,_local_8c0);
  uVar100 = auVar8._0_4_;
  local_220._4_4_ = uVar100;
  local_220._0_4_ = uVar100;
  local_220._8_4_ = uVar100;
  local_220._12_4_ = uVar100;
  local_220._16_4_ = uVar100;
  local_220._20_4_ = uVar100;
  local_220._24_4_ = uVar100;
  local_220._28_4_ = uVar100;
  auVar224 = ZEXT3264(local_220);
  fVar104 = *(float *)(ray + k * 4 + 0x60);
  local_9c0 = ZEXT416((uint)local_260);
  local_260 = fVar104 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_5e0 = uVar93;
  uStack_5dc = uVar93;
  uStack_5d8 = uVar93;
  uStack_5d4 = uVar93;
  uStack_5d0 = uVar93;
  uStack_5cc = uVar93;
  uStack_5c8 = uVar93;
  uStack_5c4 = uVar93;
  local_600 = uVar3;
  uStack_5fc = uVar3;
  uStack_5f8 = uVar3;
  uStack_5f4 = uVar3;
  uStack_5f0 = uVar3;
  uStack_5ec = uVar3;
  uStack_5e8 = uVar3;
  uStack_5e4 = uVar3;
  uVar101 = 1;
  uVar99 = 0;
  local_540 = auVar13._0_4_;
  uStack_53c = local_540;
  uStack_538 = local_540;
  uStack_534 = local_540;
  uStack_530 = local_540;
  uStack_52c = local_540;
  uStack_528 = local_540;
  uStack_524 = local_540;
  local_560 = auVar109._0_4_;
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  local_580 = auVar10._0_4_;
  uStack_57c = local_580;
  uStack_578 = local_580;
  uStack_574 = local_580;
  uStack_570 = local_580;
  uStack_56c = local_580;
  uStack_568 = local_580;
  uStack_564 = local_580;
  fVar131 = auVar11._0_4_;
  local_5a0 = fVar131;
  fStack_59c = fVar131;
  fStack_598 = fVar131;
  fStack_594 = fVar131;
  fStack_590 = fVar131;
  fStack_58c = fVar131;
  fStack_588 = fVar131;
  fStack_584 = fVar131;
  auVar125._4_4_ = uStack_95c;
  auVar125._0_4_ = local_960;
  auVar125._8_4_ = uStack_958;
  auVar125._12_4_ = uStack_954;
  auVar125._16_4_ = uStack_950;
  auVar125._20_4_ = uStack_94c;
  auVar125._24_4_ = uStack_948;
  auVar125._28_4_ = uStack_944;
  local_5c0 = vandps_avx(local_220,auVar125);
  auVar8 = vsqrtss_avx(local_a70,local_a70);
  auVar9 = vsqrtss_avx(local_a70,local_a70);
  local_9d0 = 0x3f80000000000000;
  uStack_9c8 = 0;
  do {
    auVar64._8_8_ = uStack_9c8;
    auVar64._0_8_ = local_9d0;
    auVar12 = vmovshdup_avx(auVar64);
    fVar225 = (float)local_9d0;
    fVar212 = auVar12._0_4_ - fVar225;
    fVar265 = fVar212 * 0.04761905;
    local_ac0._4_4_ = fVar225;
    local_ac0._0_4_ = fVar225;
    local_ac0._8_4_ = fVar225;
    local_ac0._12_4_ = fVar225;
    local_ac0._16_4_ = fVar225;
    local_ac0._20_4_ = fVar225;
    local_ac0._24_4_ = fVar225;
    local_ac0._28_4_ = fVar225;
    local_a40._4_4_ = fVar212;
    local_a40._0_4_ = fVar212;
    local_a40._8_4_ = fVar212;
    local_a40._12_4_ = fVar212;
    local_a40._16_4_ = fVar212;
    local_a40._20_4_ = fVar212;
    local_a40._24_4_ = fVar212;
    local_a40._28_4_ = fVar212;
    auVar12 = vfmadd231ps_fma(local_ac0,local_a40,_DAT_02020f20);
    auVar122._8_4_ = 0x3f800000;
    auVar122._0_8_ = &DAT_3f8000003f800000;
    auVar122._12_4_ = 0x3f800000;
    auVar122._16_4_ = 0x3f800000;
    auVar122._20_4_ = 0x3f800000;
    auVar122._24_4_ = 0x3f800000;
    auVar122._28_4_ = 0x3f800000;
    auVar120 = vsubps_avx(auVar122,ZEXT1632(auVar12));
    fVar212 = auVar120._0_4_;
    fVar226 = auVar120._4_4_;
    fVar298 = auVar120._8_4_;
    fVar227 = auVar120._12_4_;
    fVar264 = auVar120._16_4_;
    fVar229 = auVar120._20_4_;
    fVar252 = auVar120._24_4_;
    fVar105 = fVar212 * fVar212 * fVar212;
    fVar132 = fVar226 * fVar226 * fVar226;
    fVar133 = fVar298 * fVar298 * fVar298;
    fVar134 = fVar227 * fVar227 * fVar227;
    fVar135 = fVar264 * fVar264 * fVar264;
    fVar136 = fVar229 * fVar229 * fVar229;
    fVar137 = fVar252 * fVar252 * fVar252;
    fVar225 = auVar12._0_4_;
    fVar228 = auVar12._4_4_;
    fVar299 = auVar12._8_4_;
    fVar251 = auVar12._12_4_;
    fVar170 = fVar225 * fVar225 * fVar225;
    fVar191 = fVar228 * fVar228 * fVar228;
    fVar192 = fVar299 * fVar299 * fVar299;
    fVar193 = fVar251 * fVar251 * fVar251;
    fVar266 = fVar212 * fVar225;
    fVar276 = fVar226 * fVar228;
    fVar277 = fVar298 * fVar299;
    fVar278 = fVar227 * fVar251;
    fVar279 = fVar264 * 0.0;
    fVar280 = fVar229 * 0.0;
    fVar281 = fVar252 * 0.0;
    fVar286 = auVar285._28_4_ + auVar297._28_4_;
    auVar14._4_4_ = fVar132 * 0.16666667;
    auVar14._0_4_ = fVar105 * 0.16666667;
    auVar14._8_4_ = fVar133 * 0.16666667;
    auVar14._12_4_ = fVar134 * 0.16666667;
    auVar14._16_4_ = fVar135 * 0.16666667;
    auVar14._20_4_ = fVar136 * 0.16666667;
    auVar14._24_4_ = fVar137 * 0.16666667;
    auVar14._28_4_ = fVar286 + 1.0;
    auVar16._4_4_ =
         (fVar226 * fVar276 * 12.0 + fVar276 * fVar228 * 6.0 + fVar191 + fVar132 * 4.0) * 0.16666667
    ;
    auVar16._0_4_ =
         (fVar212 * fVar266 * 12.0 + fVar266 * fVar225 * 6.0 + fVar170 + fVar105 * 4.0) * 0.16666667
    ;
    auVar16._8_4_ =
         (fVar298 * fVar277 * 12.0 + fVar277 * fVar299 * 6.0 + fVar192 + fVar133 * 4.0) * 0.16666667
    ;
    auVar16._12_4_ =
         (fVar227 * fVar278 * 12.0 + fVar278 * fVar251 * 6.0 + fVar193 + fVar134 * 4.0) * 0.16666667
    ;
    auVar16._16_4_ =
         (fVar264 * fVar279 * 12.0 + fVar279 * 0.0 * 6.0 + fVar135 * 4.0 + 0.0) * 0.16666667;
    auVar16._20_4_ =
         (fVar229 * fVar280 * 12.0 + fVar280 * 0.0 * 6.0 + fVar136 * 4.0 + 0.0) * 0.16666667;
    auVar16._24_4_ =
         (fVar252 * fVar281 * 12.0 + fVar281 * 0.0 * 6.0 + fVar137 * 4.0 + 0.0) * 0.16666667;
    auVar16._28_4_ = auVar291._28_4_;
    auVar124._4_4_ =
         (fVar191 * 4.0 + fVar132 + fVar276 * fVar228 * 12.0 + fVar226 * fVar276 * 6.0) * 0.16666667
    ;
    auVar124._0_4_ =
         (fVar170 * 4.0 + fVar105 + fVar266 * fVar225 * 12.0 + fVar212 * fVar266 * 6.0) * 0.16666667
    ;
    auVar124._8_4_ =
         (fVar192 * 4.0 + fVar133 + fVar277 * fVar299 * 12.0 + fVar298 * fVar277 * 6.0) * 0.16666667
    ;
    auVar124._12_4_ =
         (fVar193 * 4.0 + fVar134 + fVar278 * fVar251 * 12.0 + fVar227 * fVar278 * 6.0) * 0.16666667
    ;
    auVar124._16_4_ = (fVar135 + 0.0 + fVar279 * 0.0 * 12.0 + fVar264 * fVar279 * 6.0) * 0.16666667;
    auVar124._20_4_ = (fVar136 + 0.0 + fVar280 * 0.0 * 12.0 + fVar229 * fVar280 * 6.0) * 0.16666667;
    auVar124._24_4_ = (fVar137 + 0.0 + fVar281 * 0.0 * 12.0 + fVar252 * fVar281 * 6.0) * 0.16666667;
    auVar124._28_4_ = auVar297._28_4_;
    fVar170 = fVar170 * 0.16666667;
    fVar191 = fVar191 * 0.16666667;
    fVar192 = fVar192 * 0.16666667;
    fVar193 = fVar193 * 0.16666667;
    auVar157._4_4_ = fVar191 * fStack_59c;
    auVar157._0_4_ = fVar170 * local_5a0;
    auVar157._8_4_ = fVar192 * fStack_598;
    auVar157._12_4_ = fVar193 * fStack_594;
    auVar157._16_4_ = fStack_590 * 0.0;
    auVar157._20_4_ = fStack_58c * 0.0;
    auVar157._24_4_ = fStack_588 * 0.0;
    auVar157._28_4_ = 0x40c00000;
    auVar260._4_4_ = fVar191 * local_4e0._4_4_;
    auVar260._0_4_ = fVar170 * (float)local_4e0;
    auVar260._8_4_ = fVar192 * (float)uStack_4d8;
    auVar260._12_4_ = fVar193 * uStack_4d8._4_4_;
    auVar260._16_4_ = (float)uStack_4d0 * 0.0;
    auVar260._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar260._24_4_ = (float)uStack_4c8 * 0.0;
    auVar260._28_4_ = 0x3e2aaaab;
    auVar274._4_4_ = fVar191 * local_500._4_4_;
    auVar274._0_4_ = fVar170 * (float)local_500;
    auVar274._8_4_ = fVar192 * (float)uStack_4f8;
    auVar274._12_4_ = fVar193 * uStack_4f8._4_4_;
    auVar274._16_4_ = (float)uStack_4f0 * 0.0;
    auVar274._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar274._24_4_ = (float)uStack_4e8 * 0.0;
    auVar274._28_4_ = 0x40800000;
    auVar17._4_4_ = fVar191 * local_520._4_4_;
    auVar17._0_4_ = fVar170 * (float)local_520;
    auVar17._8_4_ = fVar192 * (float)uStack_518;
    auVar17._12_4_ = fVar193 * uStack_518._4_4_;
    auVar17._16_4_ = (float)uStack_510 * 0.0;
    auVar17._20_4_ = uStack_510._4_4_ * 0.0;
    auVar17._24_4_ = (float)uStack_508 * 0.0;
    auVar17._28_4_ = fVar286 + 4.0;
    auVar71._4_4_ = uStack_57c;
    auVar71._0_4_ = local_580;
    auVar71._8_4_ = uStack_578;
    auVar71._12_4_ = uStack_574;
    auVar71._16_4_ = uStack_570;
    auVar71._20_4_ = uStack_56c;
    auVar71._24_4_ = uStack_568;
    auVar71._28_4_ = uStack_564;
    auVar12 = vfmadd231ps_fma(auVar157,auVar124,auVar71);
    auVar89._8_8_ = uStack_1d8;
    auVar89._0_8_ = local_1e0;
    auVar89._16_8_ = uStack_1d0;
    auVar89._24_8_ = uStack_1c8;
    auVar108 = vfmadd231ps_fma(auVar260,auVar124,auVar89);
    auVar88._8_8_ = uStack_1f8;
    auVar88._0_8_ = local_200;
    auVar88._16_8_ = uStack_1f0;
    auVar88._24_8_ = uStack_1e8;
    auVar115 = vfmadd231ps_fma(auVar274,auVar124,auVar88);
    auVar77._8_8_ = uStack_4b8;
    auVar77._0_8_ = local_4c0;
    auVar77._16_8_ = uStack_4b0;
    auVar77._24_8_ = uStack_4a8;
    auVar139 = vfmadd231ps_fma(auVar17,auVar124,auVar77);
    auVar73._4_4_ = uStack_55c;
    auVar73._0_4_ = local_560;
    auVar73._8_4_ = uStack_558;
    auVar73._12_4_ = uStack_554;
    auVar73._16_4_ = uStack_550;
    auVar73._20_4_ = uStack_54c;
    auVar73._24_4_ = uStack_548;
    auVar73._28_4_ = uStack_544;
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar16,auVar73);
    auVar81._8_8_ = uStack_478;
    auVar81._0_8_ = local_480;
    auVar81._16_8_ = uStack_470;
    auVar81._24_8_ = uStack_468;
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar16,auVar81);
    auVar90._8_8_ = uStack_1b8;
    auVar90._0_8_ = local_1c0;
    auVar90._16_8_ = uStack_1b0;
    auVar90._24_8_ = uStack_1a8;
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar16,auVar90);
    auVar79._8_8_ = uStack_498;
    auVar79._0_8_ = local_4a0;
    auVar79._16_8_ = uStack_490;
    auVar79._24_8_ = uStack_488;
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar16,auVar79);
    auVar75._4_4_ = uStack_53c;
    auVar75._0_4_ = local_540;
    auVar75._8_4_ = uStack_538;
    auVar75._12_4_ = uStack_534;
    auVar75._16_4_ = uStack_530;
    auVar75._20_4_ = uStack_52c;
    auVar75._24_4_ = uStack_528;
    auVar75._28_4_ = uStack_524;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar14,auVar75);
    auVar85._8_8_ = uStack_438;
    auVar85._0_8_ = local_440;
    auVar85._16_8_ = uStack_430;
    auVar85._24_8_ = uStack_428;
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar14,auVar85);
    auVar91._8_8_ = uStack_198;
    auVar91._0_8_ = local_1a0;
    auVar91._16_8_ = uStack_190;
    auVar91._24_8_ = uStack_188;
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar14,auVar91);
    auVar83._8_8_ = uStack_458;
    auVar83._0_8_ = local_460;
    auVar83._16_8_ = uStack_450;
    auVar83._24_8_ = uStack_448;
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar14,auVar83);
    auVar241._0_4_ = (float)((uint)fVar225 ^ local_7a0) * fVar225;
    auVar241._4_4_ = (float)((uint)fVar228 ^ uStack_79c) * fVar228;
    auVar241._8_4_ = (float)((uint)fVar299 ^ uStack_798) * fVar299;
    auVar241._12_4_ = (float)((uint)fVar251 ^ uStack_794) * fVar251;
    auVar241._16_4_ = fStack_790 * 0.0;
    auVar241._20_4_ = fStack_78c * 0.0;
    auVar241._24_4_ = fStack_788 * 0.0;
    auVar241._28_4_ = 0;
    auVar19._4_4_ = fVar276 * 4.0;
    auVar19._0_4_ = fVar266 * 4.0;
    auVar19._8_4_ = fVar277 * 4.0;
    auVar19._12_4_ = fVar278 * 4.0;
    auVar19._16_4_ = fVar279 * 4.0;
    auVar19._20_4_ = fVar280 * 4.0;
    fVar105 = auVar275._28_4_;
    auVar19._24_4_ = fVar281 * 4.0;
    auVar19._28_4_ = fVar105;
    auVar125 = vsubps_avx(auVar241,auVar19);
    auVar248._4_4_ = fVar226 * (float)((uint)fVar226 ^ uStack_79c) * 0.5;
    auVar248._0_4_ = fVar212 * (float)((uint)fVar212 ^ local_7a0) * 0.5;
    auVar248._8_4_ = fVar298 * (float)((uint)fVar298 ^ uStack_798) * 0.5;
    auVar248._12_4_ = fVar227 * (float)((uint)fVar227 ^ uStack_794) * 0.5;
    auVar248._16_4_ = fVar264 * (float)((uint)fVar264 ^ (uint)fStack_790) * 0.5;
    auVar248._20_4_ = fVar229 * (float)((uint)fVar229 ^ (uint)fStack_78c) * 0.5;
    auVar248._24_4_ = fVar252 * (float)((uint)fVar252 ^ (uint)fStack_788) * 0.5;
    auVar248._28_4_ = auVar120._28_4_;
    auVar20._4_4_ = auVar125._4_4_ * 0.5;
    auVar20._0_4_ = auVar125._0_4_ * 0.5;
    auVar20._8_4_ = auVar125._8_4_ * 0.5;
    auVar20._12_4_ = auVar125._12_4_ * 0.5;
    auVar20._16_4_ = auVar125._16_4_ * 0.5;
    auVar20._20_4_ = auVar125._20_4_ * 0.5;
    auVar20._24_4_ = auVar125._24_4_ * 0.5;
    auVar20._28_4_ = auVar125._28_4_;
    auVar181._4_4_ = (fVar276 * 4.0 + fVar226 * fVar226) * 0.5;
    auVar181._0_4_ = (fVar266 * 4.0 + fVar212 * fVar212) * 0.5;
    auVar181._8_4_ = (fVar277 * 4.0 + fVar298 * fVar298) * 0.5;
    auVar181._12_4_ = (fVar278 * 4.0 + fVar227 * fVar227) * 0.5;
    auVar181._16_4_ = (fVar279 * 4.0 + fVar264 * fVar264) * 0.5;
    auVar181._20_4_ = (fVar280 * 4.0 + fVar229 * fVar229) * 0.5;
    auVar181._24_4_ = (fVar281 * 4.0 + fVar252 * fVar252) * 0.5;
    auVar181._28_4_ = fVar105 + auVar250._28_4_;
    fVar212 = fVar225 * fVar225 * 0.5;
    fVar225 = fVar228 * fVar228 * 0.5;
    fVar226 = fVar299 * fVar299 * 0.5;
    fVar228 = fVar251 * fVar251 * 0.5;
    auVar273._4_4_ = fVar225 * fStack_59c;
    auVar273._0_4_ = fVar212 * local_5a0;
    auVar273._8_4_ = fVar226 * fStack_598;
    auVar273._12_4_ = fVar228 * fStack_594;
    auVar273._16_4_ = fStack_590 * 0.0;
    auVar273._20_4_ = fStack_58c * 0.0;
    auVar273._24_4_ = fStack_588 * 0.0;
    auVar273._28_4_ = fVar105;
    auVar284._4_4_ = fVar225 * local_4e0._4_4_;
    auVar284._0_4_ = fVar212 * (float)local_4e0;
    auVar284._8_4_ = fVar226 * (float)uStack_4d8;
    auVar284._12_4_ = fVar228 * uStack_4d8._4_4_;
    auVar284._16_4_ = (float)uStack_4d0 * 0.0;
    auVar284._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar284._24_4_ = (float)uStack_4c8 * 0.0;
    auVar284._28_4_ = uStack_784;
    auVar247._4_4_ = fVar225 * local_500._4_4_;
    auVar247._0_4_ = fVar212 * (float)local_500;
    auVar247._8_4_ = fVar226 * (float)uStack_4f8;
    auVar247._12_4_ = fVar228 * uStack_4f8._4_4_;
    auVar247._16_4_ = (float)uStack_4f0 * 0.0;
    auVar247._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar247._24_4_ = (float)uStack_4e8 * 0.0;
    auVar247._28_4_ = auVar291._28_4_;
    auVar300._4_4_ = fVar225 * local_520._4_4_;
    auVar300._0_4_ = fVar212 * (float)local_520;
    auVar300._8_4_ = fVar226 * (float)uStack_518;
    auVar300._12_4_ = fVar228 * uStack_518._4_4_;
    auVar300._16_4_ = (float)uStack_510 * 0.0;
    auVar300._20_4_ = uStack_510._4_4_ * 0.0;
    auVar300._24_4_ = (float)uStack_508 * 0.0;
    auVar300._28_4_ = auVar224._28_4_;
    auVar72._4_4_ = uStack_57c;
    auVar72._0_4_ = local_580;
    auVar72._8_4_ = uStack_578;
    auVar72._12_4_ = uStack_574;
    auVar72._16_4_ = uStack_570;
    auVar72._20_4_ = uStack_56c;
    auVar72._24_4_ = uStack_568;
    auVar72._28_4_ = uStack_564;
    auVar12 = vfmadd231ps_fma(auVar273,auVar181,auVar72);
    auVar140 = vfmadd231ps_fma(auVar284,auVar181,auVar89);
    auVar148 = vfmadd231ps_fma(auVar247,auVar181,auVar88);
    auVar78._8_8_ = uStack_4b8;
    auVar78._0_8_ = local_4c0;
    auVar78._16_8_ = uStack_4b0;
    auVar78._24_8_ = uStack_4a8;
    auVar214 = vfmadd231ps_fma(auVar300,auVar181,auVar78);
    auVar74._4_4_ = uStack_55c;
    auVar74._0_4_ = local_560;
    auVar74._8_4_ = uStack_558;
    auVar74._12_4_ = uStack_554;
    auVar74._16_4_ = uStack_550;
    auVar74._20_4_ = uStack_54c;
    auVar74._24_4_ = uStack_548;
    auVar74._28_4_ = uStack_544;
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar20,auVar74);
    auVar82._8_8_ = uStack_478;
    auVar82._0_8_ = local_480;
    auVar82._16_8_ = uStack_470;
    auVar82._24_8_ = uStack_468;
    auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar20,auVar82);
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar20,auVar90);
    auVar80._8_8_ = uStack_498;
    auVar80._0_8_ = local_4a0;
    auVar80._16_8_ = uStack_490;
    auVar80._24_8_ = uStack_488;
    auVar214 = vfmadd231ps_fma(ZEXT1632(auVar214),auVar20,auVar80);
    auVar76._4_4_ = uStack_53c;
    auVar76._0_4_ = local_540;
    auVar76._8_4_ = uStack_538;
    auVar76._12_4_ = uStack_534;
    auVar76._16_4_ = uStack_530;
    auVar76._20_4_ = uStack_52c;
    auVar76._24_4_ = uStack_528;
    auVar76._28_4_ = uStack_524;
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar248,auVar76);
    auVar86._8_8_ = uStack_438;
    auVar86._0_8_ = local_440;
    auVar86._16_8_ = uStack_430;
    auVar86._24_8_ = uStack_428;
    auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar248,auVar86);
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar248,auVar91);
    auVar84._8_8_ = uStack_458;
    auVar84._0_8_ = local_460;
    auVar84._16_8_ = uStack_450;
    auVar84._24_8_ = uStack_448;
    auVar214 = vfmadd231ps_fma(ZEXT1632(auVar214),auVar248,auVar84);
    auVar270._0_4_ = auVar12._0_4_ * fVar265;
    auVar270._4_4_ = auVar12._4_4_ * fVar265;
    auVar270._8_4_ = auVar12._8_4_ * fVar265;
    auVar270._12_4_ = auVar12._12_4_ * fVar265;
    auVar270._16_4_ = fVar265 * 0.0;
    auVar270._20_4_ = fVar265 * 0.0;
    auVar270._24_4_ = fVar265 * 0.0;
    local_a20._28_4_ = 0;
    local_a20._0_28_ = auVar270;
    fVar225 = auVar140._0_4_ * fVar265;
    fVar226 = auVar140._4_4_ * fVar265;
    local_b40._4_4_ = fVar226;
    local_b40._0_4_ = fVar225;
    fVar298 = auVar140._8_4_ * fVar265;
    local_b40._8_4_ = fVar298;
    fVar299 = auVar140._12_4_ * fVar265;
    local_b40._12_4_ = fVar299;
    local_b40._16_4_ = fVar265 * 0.0;
    local_b40._20_4_ = fVar265 * 0.0;
    local_b40._24_4_ = fVar265 * 0.0;
    local_b40._28_4_ = (int)((ulong)uStack_188 >> 0x20);
    local_800._0_4_ = auVar148._0_4_ * fVar265;
    local_800._4_4_ = auVar148._4_4_ * fVar265;
    local_800._8_4_ = auVar148._8_4_ * fVar265;
    local_800._12_4_ = auVar148._12_4_ * fVar265;
    local_800._16_4_ = fVar265 * 0.0;
    local_800._20_4_ = fVar265 * 0.0;
    local_800._24_4_ = fVar265 * 0.0;
    local_800._28_4_ = 0;
    auVar221._0_4_ = fVar265 * auVar214._0_4_;
    auVar221._4_4_ = fVar265 * auVar214._4_4_;
    auVar221._8_4_ = fVar265 * auVar214._8_4_;
    auVar221._12_4_ = fVar265 * auVar214._12_4_;
    auVar221._16_4_ = fVar265 * 0.0;
    auVar221._20_4_ = fVar265 * 0.0;
    auVar221._24_4_ = fVar265 * 0.0;
    auVar221._28_4_ = 0;
    auVar19 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar107));
    auVar248 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar108));
    _local_b20 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar115));
    auVar16 = vsubps_avx(auVar19,ZEXT1632(auVar107));
    auVar124 = vsubps_avx(_local_b20,ZEXT1632(auVar115));
    fVar212 = auVar124._0_4_;
    fVar228 = auVar124._4_4_;
    auVar307._4_4_ = auVar270._4_4_ * fVar228;
    auVar307._0_4_ = auVar270._0_4_ * fVar212;
    fVar227 = auVar124._8_4_;
    auVar307._8_4_ = auVar270._8_4_ * fVar227;
    fVar229 = auVar124._12_4_;
    auVar307._12_4_ = auVar270._12_4_ * fVar229;
    fVar105 = auVar124._16_4_;
    auVar307._16_4_ = auVar270._16_4_ * fVar105;
    fVar133 = auVar124._20_4_;
    auVar307._20_4_ = auVar270._20_4_ * fVar133;
    fVar135 = auVar124._24_4_;
    auVar307._24_4_ = auVar270._24_4_ * fVar135;
    auVar307._28_4_ = auVar125._28_4_;
    auVar12 = vfmsub231ps_fma(auVar307,local_800,auVar16);
    auVar157 = vsubps_avx(auVar248,ZEXT1632(auVar108));
    fVar281 = auVar16._0_4_;
    fVar286 = auVar16._4_4_;
    auVar15._4_4_ = fVar286 * fVar226;
    auVar15._0_4_ = fVar281 * fVar225;
    fVar309 = auVar16._8_4_;
    auVar15._8_4_ = fVar309 * fVar298;
    fVar310 = auVar16._12_4_;
    auVar15._12_4_ = fVar310 * fVar299;
    fVar311 = auVar16._16_4_;
    auVar15._16_4_ = fVar311 * fVar265 * 0.0;
    fVar312 = auVar16._20_4_;
    auVar15._20_4_ = fVar312 * fVar265 * 0.0;
    fVar313 = auVar16._24_4_;
    auVar15._24_4_ = fVar313 * fVar265 * 0.0;
    auVar15._28_4_ = auVar19._28_4_;
    auVar140 = vfmsub231ps_fma(auVar15,local_a20,auVar157);
    auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar140._12_4_ * auVar140._12_4_,
                                                 CONCAT48(auVar140._8_4_ * auVar140._8_4_,
                                                          CONCAT44(auVar140._4_4_ * auVar140._4_4_,
                                                                   auVar140._0_4_ * auVar140._0_4_))
                                                )),ZEXT1632(auVar12),ZEXT1632(auVar12));
    fVar192 = auVar157._0_4_;
    fVar193 = auVar157._4_4_;
    auVar21._4_4_ = fVar193 * local_800._4_4_;
    auVar21._0_4_ = fVar192 * local_800._0_4_;
    fVar266 = auVar157._8_4_;
    auVar21._8_4_ = fVar266 * local_800._8_4_;
    fVar276 = auVar157._12_4_;
    auVar21._12_4_ = fVar276 * local_800._12_4_;
    fVar277 = auVar157._16_4_;
    auVar21._16_4_ = fVar277 * local_800._16_4_;
    fVar278 = auVar157._20_4_;
    auVar21._20_4_ = fVar278 * local_800._20_4_;
    fVar279 = auVar157._24_4_;
    auVar21._24_4_ = fVar279 * local_800._24_4_;
    auVar21._28_4_ = auVar248._28_4_;
    auVar148 = vfmsub231ps_fma(auVar21,local_b40,auVar124);
    auVar242._0_4_ = fVar212 * fVar212;
    auVar242._4_4_ = fVar228 * fVar228;
    auVar242._8_4_ = fVar227 * fVar227;
    auVar242._12_4_ = fVar229 * fVar229;
    auVar242._16_4_ = fVar105 * fVar105;
    auVar242._20_4_ = fVar133 * fVar133;
    auVar242._24_4_ = fVar135 * fVar135;
    auVar242._28_4_ = 0;
    auVar140 = vfmadd231ps_fma(auVar242,auVar157,auVar157);
    auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar16,auVar16);
    auVar120 = vrcpps_avx(ZEXT1632(auVar140));
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar148),ZEXT1632(auVar148));
    auVar238._8_4_ = 0x3f800000;
    auVar238._0_8_ = &DAT_3f8000003f800000;
    auVar238._12_4_ = 0x3f800000;
    auVar238._16_4_ = 0x3f800000;
    auVar238._20_4_ = 0x3f800000;
    auVar238._24_4_ = 0x3f800000;
    auVar238._28_4_ = 0x3f800000;
    auVar12 = vfnmadd213ps_fma(auVar120,ZEXT1632(auVar140),auVar238);
    auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar120,auVar120);
    local_b60 = vpermps_avx2(_DAT_0205d4a0,local_a20);
    local_aa0 = vpermps_avx2(_DAT_0205d4a0,local_800);
    auVar92._4_4_ = fVar228 * local_b60._4_4_;
    auVar92._0_4_ = fVar212 * local_b60._0_4_;
    auVar92._8_4_ = fVar227 * local_b60._8_4_;
    auVar92._12_4_ = fVar229 * local_b60._12_4_;
    auVar92._16_4_ = fVar105 * local_b60._16_4_;
    auVar92._20_4_ = fVar133 * local_b60._20_4_;
    auVar92._24_4_ = fVar135 * local_b60._24_4_;
    auVar92._28_4_ = DAT_0205d4a0._28_4_;
    auVar214 = vfmsub231ps_fma(auVar92,local_aa0,auVar16);
    local_b80 = vpermps_avx2(_DAT_0205d4a0,local_b40);
    auVar22._4_4_ = fVar286 * local_b80._4_4_;
    auVar22._0_4_ = fVar281 * local_b80._0_4_;
    auVar22._8_4_ = fVar309 * local_b80._8_4_;
    auVar22._12_4_ = fVar310 * local_b80._12_4_;
    auVar22._16_4_ = fVar311 * local_b80._16_4_;
    auVar22._20_4_ = fVar312 * local_b80._20_4_;
    auVar22._24_4_ = fVar313 * local_b80._24_4_;
    auVar22._28_4_ = DAT_0205d4a0._28_4_;
    auVar106 = vfmsub231ps_fma(auVar22,local_b60,auVar157);
    auVar214 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar106._12_4_ * auVar106._12_4_,
                                                  CONCAT48(auVar106._8_4_ * auVar106._8_4_,
                                                           CONCAT44(auVar106._4_4_ * auVar106._4_4_,
                                                                    auVar106._0_4_ * auVar106._0_4_)
                                                          ))),ZEXT1632(auVar214),ZEXT1632(auVar214))
    ;
    fVar225 = local_aa0._0_4_;
    auVar256._0_4_ = fVar192 * fVar225;
    fVar298 = local_aa0._4_4_;
    auVar256._4_4_ = fVar193 * fVar298;
    fVar251 = local_aa0._8_4_;
    auVar256._8_4_ = fVar266 * fVar251;
    fVar252 = local_aa0._12_4_;
    auVar256._12_4_ = fVar276 * fVar252;
    fVar132 = local_aa0._16_4_;
    auVar256._16_4_ = fVar277 * fVar132;
    fVar134 = local_aa0._20_4_;
    auVar256._20_4_ = fVar278 * fVar134;
    fVar136 = local_aa0._24_4_;
    auVar256._24_4_ = fVar279 * fVar136;
    auVar256._28_4_ = 0;
    auVar106 = vfmsub231ps_fma(auVar256,local_b80,auVar124);
    auVar214 = vfmadd231ps_fma(ZEXT1632(auVar214),ZEXT1632(auVar106),ZEXT1632(auVar106));
    auVar120 = vmaxps_avx(ZEXT1632(CONCAT412(auVar148._12_4_ * auVar12._12_4_,
                                             CONCAT48(auVar148._8_4_ * auVar12._8_4_,
                                                      CONCAT44(auVar148._4_4_ * auVar12._4_4_,
                                                               auVar148._0_4_ * auVar12._0_4_)))),
                          ZEXT1632(CONCAT412(auVar214._12_4_ * auVar12._12_4_,
                                             CONCAT48(auVar214._8_4_ * auVar12._8_4_,
                                                      CONCAT44(auVar214._4_4_ * auVar12._4_4_,
                                                               auVar214._0_4_ * auVar12._0_4_)))));
    local_840._0_4_ = auVar221._0_4_ + auVar139._0_4_;
    local_840._4_4_ = auVar221._4_4_ + auVar139._4_4_;
    local_840._8_4_ = auVar221._8_4_ + auVar139._8_4_;
    local_840._12_4_ = auVar221._12_4_ + auVar139._12_4_;
    local_840._16_4_ = auVar221._16_4_ + 0.0;
    local_840._20_4_ = auVar221._20_4_ + 0.0;
    local_840._24_4_ = auVar221._24_4_ + 0.0;
    local_840._28_4_ = 0;
    auVar125 = vsubps_avx(ZEXT1632(auVar139),auVar221);
    local_860 = vpermps_avx2(_DAT_0205d4a0,auVar125);
    local_820 = ZEXT1632(auVar139);
    auVar20 = vpermps_avx2(_DAT_0205d4a0,local_820);
    auVar125 = vmaxps_avx(local_820,local_840);
    auVar121 = vmaxps_avx(local_860,auVar20);
    auVar14 = vrsqrtps_avx(ZEXT1632(auVar140));
    auVar121 = vmaxps_avx(auVar125,auVar121);
    uVar100 = auVar125._28_4_;
    fVar226 = auVar14._0_4_;
    fVar299 = auVar14._4_4_;
    fVar264 = auVar14._8_4_;
    fVar265 = auVar14._12_4_;
    fVar137 = auVar14._16_4_;
    fVar170 = auVar14._20_4_;
    fVar191 = auVar14._24_4_;
    auVar271._0_4_ = fVar226 * fVar226 * fVar226 * auVar140._0_4_ * -0.5;
    auVar271._4_4_ = fVar299 * fVar299 * fVar299 * auVar140._4_4_ * -0.5;
    auVar271._8_4_ = fVar264 * fVar264 * fVar264 * auVar140._8_4_ * -0.5;
    auVar271._12_4_ = fVar265 * fVar265 * fVar265 * auVar140._12_4_ * -0.5;
    auVar271._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
    auVar271._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
    auVar271._24_4_ = fVar191 * fVar191 * fVar191 * -0.0;
    auVar271._28_4_ = 0;
    auVar123._8_4_ = 0x3fc00000;
    auVar123._0_8_ = 0x3fc000003fc00000;
    auVar123._12_4_ = 0x3fc00000;
    auVar123._16_4_ = 0x3fc00000;
    auVar123._20_4_ = 0x3fc00000;
    auVar123._24_4_ = 0x3fc00000;
    auVar123._28_4_ = 0x3fc00000;
    auVar12 = vfmadd231ps_fma(auVar271,auVar123,auVar14);
    fVar226 = auVar12._0_4_;
    fVar299 = auVar12._4_4_;
    auVar23._4_4_ = fVar193 * fVar299;
    auVar23._0_4_ = fVar192 * fVar226;
    fVar264 = auVar12._8_4_;
    auVar23._8_4_ = fVar266 * fVar264;
    fVar265 = auVar12._12_4_;
    auVar23._12_4_ = fVar276 * fVar265;
    auVar23._16_4_ = fVar277 * 0.0;
    auVar23._20_4_ = fVar278 * 0.0;
    auVar23._24_4_ = fVar279 * 0.0;
    auVar23._28_4_ = uVar100;
    auVar24._4_4_ = (float)local_940._4_4_ * fVar299 * fVar228;
    auVar24._0_4_ = (float)local_940._0_4_ * fVar226 * fVar212;
    auVar24._8_4_ = fStack_938 * fVar264 * fVar227;
    auVar24._12_4_ = fStack_934 * fVar265 * fVar229;
    auVar24._16_4_ = fStack_930 * fVar105 * 0.0;
    auVar24._20_4_ = fStack_92c * fVar133 * 0.0;
    auVar24._24_4_ = fStack_928 * fVar135 * 0.0;
    auVar24._28_4_ = auVar157._28_4_;
    auVar139 = vfmadd231ps_fma(auVar24,auVar23,_local_8e0);
    auVar297 = ZEXT864(0) << 0x20;
    auVar181 = ZEXT1632(auVar115);
    auVar125 = vsubps_avx(ZEXT832(0) << 0x20,auVar181);
    auVar291 = ZEXT3264(auVar125);
    fVar193 = auVar125._0_4_;
    auVar272._0_4_ = fVar193 * fVar226 * fVar212;
    fVar266 = auVar125._4_4_;
    auVar272._4_4_ = fVar266 * fVar299 * fVar228;
    fVar276 = auVar125._8_4_;
    auVar272._8_4_ = fVar276 * fVar264 * fVar227;
    fVar277 = auVar125._12_4_;
    auVar272._12_4_ = fVar277 * fVar265 * fVar229;
    fVar278 = auVar125._16_4_;
    auVar272._16_4_ = fVar278 * fVar105 * 0.0;
    fVar279 = auVar125._20_4_;
    auVar272._20_4_ = fVar279 * fVar133 * 0.0;
    fVar280 = auVar125._24_4_;
    auVar272._24_4_ = fVar280 * fVar135 * 0.0;
    auVar272._28_4_ = 0;
    auVar300 = ZEXT1632(auVar108);
    auVar14 = vsubps_avx(ZEXT832(0) << 0x20,auVar300);
    auVar108 = vfmadd231ps_fma(auVar272,auVar14,auVar23);
    auVar25._4_4_ = fVar286 * fVar299;
    auVar25._0_4_ = fVar281 * fVar226;
    auVar25._8_4_ = fVar309 * fVar264;
    auVar25._12_4_ = fVar310 * fVar265;
    auVar25._16_4_ = fVar311 * 0.0;
    auVar25._20_4_ = fVar312 * 0.0;
    auVar25._24_4_ = fVar313 * 0.0;
    auVar25._28_4_ = uVar100;
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar25,_local_8c0);
    auVar285 = ZEXT1664(auVar115);
    auVar307 = ZEXT1632(auVar107);
    auVar247 = ZEXT832(0) << 0x20;
    auVar260 = vsubps_avx(auVar247,auVar307);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar260,auVar25);
    auVar275 = ZEXT1664(auVar108);
    auVar26._4_4_ = (float)local_940._4_4_ * fVar266;
    auVar26._0_4_ = (float)local_940._0_4_ * fVar193;
    auVar26._8_4_ = fStack_938 * fVar276;
    auVar26._12_4_ = fStack_934 * fVar277;
    auVar26._16_4_ = fStack_930 * fVar278;
    auVar26._20_4_ = fStack_92c * fVar279;
    auVar26._24_4_ = fStack_928 * fVar280;
    auVar26._28_4_ = uVar100;
    auVar139 = vfmadd231ps_fma(auVar26,_local_8e0,auVar14);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),_local_8c0,auVar260);
    fVar212 = auVar108._0_4_;
    fVar137 = auVar115._0_4_;
    fVar228 = auVar108._4_4_;
    fVar170 = auVar115._4_4_;
    fVar227 = auVar108._8_4_;
    fVar191 = auVar115._8_4_;
    fVar229 = auVar108._12_4_;
    fVar192 = auVar115._12_4_;
    auVar27._28_4_ = uStack_924;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar192 * fVar229,
                            CONCAT48(fVar191 * fVar227,CONCAT44(fVar170 * fVar228,fVar137 * fVar212)
                                    )));
    auVar274 = vsubps_avx(ZEXT1632(auVar139),auVar27);
    auVar28._4_4_ = fVar266 * fVar266;
    auVar28._0_4_ = fVar193 * fVar193;
    auVar28._8_4_ = fVar276 * fVar276;
    auVar28._12_4_ = fVar277 * fVar277;
    auVar28._16_4_ = fVar278 * fVar278;
    auVar28._20_4_ = fVar279 * fVar279;
    auVar28._24_4_ = fVar280 * fVar280;
    auVar28._28_4_ = uStack_924;
    auVar139 = vfmadd231ps_fma(auVar28,auVar14,auVar14);
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar260,auVar260);
    auVar17 = vsubps_avx(ZEXT1632(auVar139),
                         ZEXT1632(CONCAT412(fVar229 * fVar229,
                                            CONCAT48(fVar227 * fVar227,
                                                     CONCAT44(fVar228 * fVar228,fVar212 * fVar212)))
                                 ));
    auVar125 = vsqrtps_avx(auVar120);
    fVar212 = (auVar125._0_4_ + auVar121._0_4_) * 1.0000002;
    fVar228 = (auVar125._4_4_ + auVar121._4_4_) * 1.0000002;
    fVar227 = (auVar125._8_4_ + auVar121._8_4_) * 1.0000002;
    fVar229 = (auVar125._12_4_ + auVar121._12_4_) * 1.0000002;
    fVar105 = (auVar125._16_4_ + auVar121._16_4_) * 1.0000002;
    fVar133 = (auVar125._20_4_ + auVar121._20_4_) * 1.0000002;
    fVar135 = (auVar125._24_4_ + auVar121._24_4_) * 1.0000002;
    auVar29._4_4_ = fVar228 * fVar228;
    auVar29._0_4_ = fVar212 * fVar212;
    auVar29._8_4_ = fVar227 * fVar227;
    auVar29._12_4_ = fVar229 * fVar229;
    auVar29._16_4_ = fVar105 * fVar105;
    auVar29._20_4_ = fVar133 * fVar133;
    auVar29._24_4_ = fVar135 * fVar135;
    auVar29._28_4_ = auVar125._28_4_ + auVar121._28_4_;
    auVar301._0_4_ = auVar274._0_4_ + auVar274._0_4_;
    auVar301._4_4_ = auVar274._4_4_ + auVar274._4_4_;
    auVar301._8_4_ = auVar274._8_4_ + auVar274._8_4_;
    auVar301._12_4_ = auVar274._12_4_ + auVar274._12_4_;
    auVar301._16_4_ = auVar274._16_4_ + auVar274._16_4_;
    auVar301._20_4_ = auVar274._20_4_ + auVar274._20_4_;
    auVar301._24_4_ = auVar274._24_4_ + auVar274._24_4_;
    fVar212 = auVar274._28_4_;
    auVar301._28_4_ = fVar212 + fVar212;
    auVar121 = vsubps_avx(auVar17,auVar29);
    auVar250 = ZEXT3264(auVar121);
    auVar284 = ZEXT1632(auVar115);
    local_ae0 = ZEXT1632(CONCAT412(fVar192 * fVar192,
                                   CONCAT48(fVar191 * fVar191,
                                            CONCAT44(fVar170 * fVar170,fVar137 * fVar137))));
    local_620 = vsubps_avx(local_220,local_ae0);
    auVar30._4_4_ = auVar301._4_4_ * auVar301._4_4_;
    auVar30._0_4_ = auVar301._0_4_ * auVar301._0_4_;
    auVar30._8_4_ = auVar301._8_4_ * auVar301._8_4_;
    auVar30._12_4_ = auVar301._12_4_ * auVar301._12_4_;
    auVar30._16_4_ = auVar301._16_4_ * auVar301._16_4_;
    auVar30._20_4_ = auVar301._20_4_ * auVar301._20_4_;
    auVar30._24_4_ = auVar301._24_4_ * auVar301._24_4_;
    auVar30._28_4_ = auVar17._28_4_;
    fVar228 = local_620._0_4_;
    fVar227 = local_620._4_4_;
    fVar229 = local_620._8_4_;
    fVar105 = local_620._12_4_;
    fVar133 = local_620._16_4_;
    fVar135 = local_620._20_4_;
    fVar137 = local_620._24_4_;
    auVar31._4_4_ = fVar227 * 4.0 * auVar121._4_4_;
    auVar31._0_4_ = fVar228 * 4.0 * auVar121._0_4_;
    auVar31._8_4_ = fVar229 * 4.0 * auVar121._8_4_;
    auVar31._12_4_ = fVar105 * 4.0 * auVar121._12_4_;
    auVar31._16_4_ = fVar133 * 4.0 * auVar121._16_4_;
    auVar31._20_4_ = fVar135 * 4.0 * auVar121._20_4_;
    auVar31._24_4_ = fVar137 * 4.0 * auVar121._24_4_;
    auVar31._28_4_ = fVar212;
    auVar274 = vsubps_avx(auVar30,auVar31);
    auVar120 = vcmpps_avx(auVar274,auVar247,5);
    auVar273 = ZEXT1632(auVar108);
    fVar212 = local_620._28_4_;
    if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar120 >> 0x7f,0) == '\0') &&
          (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar120 >> 0xbf,0) == '\0') &&
        (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar120[0x1f])
    {
      local_cc0._8_4_ = 0x7f800000;
      local_cc0._0_8_ = 0x7f8000007f800000;
      local_cc0._12_4_ = 0x7f800000;
      local_cc0._16_4_ = 0x7f800000;
      local_cc0._20_4_ = 0x7f800000;
      local_cc0._24_4_ = 0x7f800000;
      local_cc0._28_4_ = 0x7f800000;
      auVar208._8_4_ = 0xff800000;
      auVar208._0_8_ = 0xff800000ff800000;
      auVar208._12_4_ = 0xff800000;
      auVar208._16_4_ = 0xff800000;
      auVar208._20_4_ = 0xff800000;
      auVar208._24_4_ = 0xff800000;
      auVar208._28_4_ = 0xff800000;
    }
    else {
      auVar247 = vcmpps_avx(auVar274,auVar247,5);
      auVar15 = vsqrtps_avx(auVar274);
      auVar302._0_4_ = fVar228 + fVar228;
      auVar302._4_4_ = fVar227 + fVar227;
      auVar302._8_4_ = fVar229 + fVar229;
      auVar302._12_4_ = fVar105 + fVar105;
      auVar302._16_4_ = fVar133 + fVar133;
      auVar302._20_4_ = fVar135 + fVar135;
      auVar302._24_4_ = fVar137 + fVar137;
      auVar302._28_4_ = fVar212 + fVar212;
      auVar274 = vrcpps_avx(auVar302);
      auVar152._8_4_ = 0x3f800000;
      auVar152._0_8_ = &DAT_3f8000003f800000;
      auVar152._12_4_ = 0x3f800000;
      auVar152._16_4_ = 0x3f800000;
      auVar152._20_4_ = 0x3f800000;
      auVar152._24_4_ = 0x3f800000;
      auVar152._28_4_ = 0x3f800000;
      auVar108 = vfnmadd213ps_fma(auVar302,auVar274,auVar152);
      auVar108 = vfmadd132ps_fma(ZEXT1632(auVar108),auVar274,auVar274);
      auVar292._0_4_ = (uint)auVar301._0_4_ ^ local_7a0;
      auVar292._4_4_ = (uint)auVar301._4_4_ ^ uStack_79c;
      auVar292._8_4_ = (uint)auVar301._8_4_ ^ uStack_798;
      auVar292._12_4_ = (uint)auVar301._12_4_ ^ uStack_794;
      auVar292._16_4_ = (uint)auVar301._16_4_ ^ (uint)fStack_790;
      auVar292._20_4_ = (uint)auVar301._20_4_ ^ (uint)fStack_78c;
      auVar292._24_4_ = (uint)auVar301._24_4_ ^ (uint)fStack_788;
      auVar292._28_4_ = (uint)auVar301._28_4_ ^ uStack_784;
      auVar274 = vsubps_avx(auVar292,auVar15);
      auVar32._4_4_ = auVar274._4_4_ * auVar108._4_4_;
      auVar32._0_4_ = auVar274._0_4_ * auVar108._0_4_;
      auVar32._8_4_ = auVar274._8_4_ * auVar108._8_4_;
      auVar32._12_4_ = auVar274._12_4_ * auVar108._12_4_;
      auVar32._16_4_ = auVar274._16_4_ * 0.0;
      auVar32._20_4_ = auVar274._20_4_ * 0.0;
      auVar32._24_4_ = auVar274._24_4_ * 0.0;
      auVar32._28_4_ = auVar274._28_4_;
      auVar274 = vsubps_avx(auVar15,auVar301);
      auVar33._4_4_ = auVar108._4_4_ * auVar274._4_4_;
      auVar33._0_4_ = auVar108._0_4_ * auVar274._0_4_;
      auVar33._8_4_ = auVar108._8_4_ * auVar274._8_4_;
      auVar33._12_4_ = auVar108._12_4_ * auVar274._12_4_;
      auVar33._16_4_ = auVar274._16_4_ * 0.0;
      auVar33._20_4_ = auVar274._20_4_ * 0.0;
      auVar33._24_4_ = auVar274._24_4_ * 0.0;
      auVar33._28_4_ = auVar274._28_4_;
      auVar108 = vfmadd213ps_fma(auVar284,auVar32,auVar273);
      local_680 = ZEXT1632(CONCAT412(auVar108._12_4_ * fVar265,
                                     CONCAT48(auVar108._8_4_ * fVar264,
                                              CONCAT44(auVar108._4_4_ * fVar299,
                                                       auVar108._0_4_ * fVar226))));
      auVar108 = vfmadd213ps_fma(auVar284,auVar33,auVar273);
      local_6a0 = ZEXT1632(CONCAT412(auVar108._12_4_ * fVar265,
                                     CONCAT48(auVar108._8_4_ * fVar264,
                                              CONCAT44(auVar108._4_4_ * fVar299,
                                                       auVar108._0_4_ * fVar226))));
      auVar153._8_4_ = 0x7f800000;
      auVar153._0_8_ = 0x7f8000007f800000;
      auVar153._12_4_ = 0x7f800000;
      auVar153._16_4_ = 0x7f800000;
      auVar153._20_4_ = 0x7f800000;
      auVar153._24_4_ = 0x7f800000;
      auVar153._28_4_ = 0x7f800000;
      local_cc0 = vblendvps_avx(auVar153,auVar32,auVar247);
      auVar66._4_4_ = uStack_95c;
      auVar66._0_4_ = local_960;
      auVar66._8_4_ = uStack_958;
      auVar66._12_4_ = uStack_954;
      auVar66._16_4_ = uStack_950;
      auVar66._20_4_ = uStack_94c;
      auVar66._24_4_ = uStack_948;
      auVar66._28_4_ = uStack_944;
      auVar274 = vandps_avx(local_ae0,auVar66);
      auVar274 = vmaxps_avx(local_5c0,auVar274);
      auVar18._4_4_ = auVar274._4_4_ * 1.9073486e-06;
      auVar18._0_4_ = auVar274._0_4_ * 1.9073486e-06;
      auVar18._8_4_ = auVar274._8_4_ * 1.9073486e-06;
      auVar18._12_4_ = auVar274._12_4_ * 1.9073486e-06;
      auVar18._16_4_ = auVar274._16_4_ * 1.9073486e-06;
      auVar18._20_4_ = auVar274._20_4_ * 1.9073486e-06;
      auVar18._24_4_ = auVar274._24_4_ * 1.9073486e-06;
      auVar18._28_4_ = auVar274._28_4_;
      auVar274 = vandps_avx(local_620,auVar66);
      auVar274 = vcmpps_avx(auVar274,auVar18,1);
      auVar154._8_4_ = 0xff800000;
      auVar154._0_8_ = 0xff800000ff800000;
      auVar154._12_4_ = 0xff800000;
      auVar154._16_4_ = 0xff800000;
      auVar154._20_4_ = 0xff800000;
      auVar154._24_4_ = 0xff800000;
      auVar154._28_4_ = 0xff800000;
      auVar208 = vblendvps_avx(auVar154,auVar33,auVar247);
      auVar15 = auVar247 & auVar274;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar120 = vandps_avx(auVar274,auVar247);
        auVar274 = vcmpps_avx(auVar121,_DAT_02020f00,2);
        auVar250 = ZEXT3264(auVar274);
        auVar130._8_4_ = 0xff800000;
        auVar130._0_8_ = 0xff800000ff800000;
        auVar130._12_4_ = 0xff800000;
        auVar130._16_4_ = 0xff800000;
        auVar130._20_4_ = 0xff800000;
        auVar130._24_4_ = 0xff800000;
        auVar130._28_4_ = 0xff800000;
        auVar169._8_4_ = 0x7f800000;
        auVar169._0_8_ = 0x7f8000007f800000;
        auVar169._12_4_ = 0x7f800000;
        auVar169._16_4_ = 0x7f800000;
        auVar169._20_4_ = 0x7f800000;
        auVar169._24_4_ = 0x7f800000;
        auVar169._28_4_ = 0x7f800000;
        auVar121 = vblendvps_avx(auVar169,auVar130,auVar274);
        auVar108 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
        auVar18 = vpmovsxwd_avx2(auVar108);
        local_cc0 = vblendvps_avx(local_cc0,auVar121,auVar18);
        auVar121 = vblendvps_avx(auVar130,auVar169,auVar274);
        auVar208 = vblendvps_avx(auVar208,auVar121,auVar18);
        auVar223._0_8_ = auVar120._0_8_ ^ 0xffffffffffffffff;
        auVar223._8_4_ = auVar120._8_4_ ^ 0xffffffff;
        auVar223._12_4_ = auVar120._12_4_ ^ 0xffffffff;
        auVar223._16_4_ = auVar120._16_4_ ^ 0xffffffff;
        auVar223._20_4_ = auVar120._20_4_ ^ 0xffffffff;
        auVar223._24_4_ = auVar120._24_4_ ^ 0xffffffff;
        auVar223._28_4_ = auVar120._28_4_ ^ 0xffffffff;
        auVar120 = vorps_avx(auVar274,auVar223);
        auVar120 = vandps_avx(auVar247,auVar120);
      }
      auVar297 = ZEXT3264(auVar18);
    }
    auVar224 = ZEXT3264(local_240);
    auVar121 = local_240 & auVar120;
    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar121 >> 0x7f,0) != '\0') ||
          (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar121 >> 0xbf,0) != '\0') ||
        (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar121[0x1f] < '\0') {
      local_280 = ZEXT1632(auVar12);
      fVar170 = *(float *)(ray + k * 4 + 0x100) - (float)local_9c0._0_4_;
      auVar246._4_4_ = fVar170;
      auVar246._0_4_ = fVar170;
      auVar246._8_4_ = fVar170;
      auVar246._12_4_ = fVar170;
      auVar246._16_4_ = fVar170;
      auVar246._20_4_ = fVar170;
      auVar246._24_4_ = fVar170;
      auVar246._28_4_ = fVar170;
      auVar274 = vminps_avx(auVar246,auVar208);
      auVar34._4_4_ = fVar266 * local_800._4_4_;
      auVar34._0_4_ = fVar193 * local_800._0_4_;
      auVar34._8_4_ = fVar276 * local_800._8_4_;
      auVar34._12_4_ = fVar277 * local_800._12_4_;
      auVar34._16_4_ = fVar278 * local_800._16_4_;
      auVar34._20_4_ = fVar279 * local_800._20_4_;
      auVar34._24_4_ = fVar280 * local_800._24_4_;
      auVar34._28_4_ = fVar170;
      auVar12 = vfmadd213ps_fma(auVar14,local_b40,auVar34);
      auVar108 = vfmadd213ps_fma(auVar260,local_a20,ZEXT1632(auVar12));
      auVar35._4_4_ = local_800._4_4_ * (float)local_940._4_4_;
      auVar35._0_4_ = local_800._0_4_ * (float)local_940._0_4_;
      auVar35._8_4_ = local_800._8_4_ * fStack_938;
      auVar35._12_4_ = local_800._12_4_ * fStack_934;
      auVar35._16_4_ = local_800._16_4_ * fStack_930;
      auVar35._20_4_ = local_800._20_4_ * fStack_92c;
      auVar35._24_4_ = local_800._24_4_ * fStack_928;
      auVar35._28_4_ = fVar170;
      auVar12 = vfmadd231ps_fma(auVar35,_local_8e0,local_b40);
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar12),_local_8c0,local_a20);
      auVar67._4_4_ = uStack_95c;
      auVar67._0_4_ = local_960;
      auVar67._8_4_ = uStack_958;
      auVar67._12_4_ = uStack_954;
      auVar67._16_4_ = uStack_950;
      auVar67._20_4_ = uStack_94c;
      auVar67._24_4_ = uStack_948;
      auVar67._28_4_ = uStack_944;
      auVar121 = vandps_avx(ZEXT1632(auVar115),auVar67);
      auVar155._8_4_ = 0x219392ef;
      auVar155._0_8_ = 0x219392ef219392ef;
      auVar155._12_4_ = 0x219392ef;
      auVar155._16_4_ = 0x219392ef;
      auVar155._20_4_ = 0x219392ef;
      auVar155._24_4_ = 0x219392ef;
      auVar155._28_4_ = 0x219392ef;
      auVar14 = vcmpps_avx(auVar121,auVar155,1);
      auVar121 = vrcpps_avx(ZEXT1632(auVar115));
      auVar308._8_4_ = 0x3f800000;
      auVar308._0_8_ = &DAT_3f8000003f800000;
      auVar308._12_4_ = 0x3f800000;
      auVar308._16_4_ = 0x3f800000;
      auVar308._20_4_ = 0x3f800000;
      auVar308._24_4_ = 0x3f800000;
      auVar308._28_4_ = 0x3f800000;
      auVar247 = ZEXT1632(auVar115);
      auVar12 = vfnmadd213ps_fma(auVar121,auVar247,auVar308);
      auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar121,auVar121);
      auVar290._0_4_ = auVar115._0_4_ ^ local_7a0;
      auVar290._4_4_ = auVar115._4_4_ ^ uStack_79c;
      auVar290._8_4_ = auVar115._8_4_ ^ uStack_798;
      auVar290._12_4_ = auVar115._12_4_ ^ uStack_794;
      auVar290._16_4_ = fStack_790;
      auVar290._20_4_ = fStack_78c;
      auVar290._24_4_ = fStack_788;
      auVar290._28_4_ = uStack_784;
      auVar293._0_4_ = auVar12._0_4_ * (float)(auVar108._0_4_ ^ local_7a0);
      auVar293._4_4_ = auVar12._4_4_ * (float)(auVar108._4_4_ ^ uStack_79c);
      auVar293._8_4_ = auVar12._8_4_ * (float)(auVar108._8_4_ ^ uStack_798);
      auVar293._12_4_ = auVar12._12_4_ * (float)(auVar108._12_4_ ^ uStack_794);
      auVar293._16_4_ = fStack_790 * 0.0;
      auVar293._20_4_ = fStack_78c * 0.0;
      auVar293._24_4_ = fStack_788 * 0.0;
      auVar293._28_4_ = 0;
      auVar121 = vcmpps_avx(auVar247,auVar290,1);
      auVar121 = vorps_avx(auVar14,auVar121);
      auVar303._8_4_ = 0xff800000;
      auVar303._0_8_ = 0xff800000ff800000;
      auVar303._12_4_ = 0xff800000;
      auVar303._16_4_ = 0xff800000;
      auVar303._20_4_ = 0xff800000;
      auVar303._24_4_ = 0xff800000;
      auVar303._28_4_ = 0xff800000;
      auVar121 = vblendvps_avx(auVar293,auVar303,auVar121);
      auVar87._4_4_ = fStack_25c;
      auVar87._0_4_ = local_260;
      auVar87._8_4_ = fStack_258;
      auVar87._12_4_ = fStack_254;
      auVar87._16_4_ = fStack_250;
      auVar87._20_4_ = fStack_24c;
      auVar87._24_4_ = fStack_248;
      auVar87._28_4_ = fStack_244;
      auVar260 = vmaxps_avx(auVar87,local_cc0);
      auVar260 = vmaxps_avx(auVar260,auVar121);
      auVar121 = vcmpps_avx(auVar247,auVar290,6);
      auVar121 = vorps_avx(auVar14,auVar121);
      auVar257._8_4_ = 0x7f800000;
      auVar257._0_8_ = 0x7f8000007f800000;
      auVar257._12_4_ = 0x7f800000;
      auVar257._16_4_ = 0x7f800000;
      auVar257._20_4_ = 0x7f800000;
      auVar257._24_4_ = 0x7f800000;
      auVar257._28_4_ = 0x7f800000;
      auVar121 = vblendvps_avx(auVar293,auVar257,auVar121);
      auVar274 = vminps_avx(auVar274,auVar121);
      auVar121 = vsubps_avx(ZEXT832(0) << 0x20,auVar248);
      auVar14 = vsubps_avx(ZEXT832(0) << 0x20,_local_b20);
      auVar36._4_4_ = auVar14._4_4_ * fVar298;
      auVar36._0_4_ = auVar14._0_4_ * fVar225;
      auVar36._8_4_ = auVar14._8_4_ * fVar251;
      auVar36._12_4_ = auVar14._12_4_ * fVar252;
      auVar36._16_4_ = auVar14._16_4_ * fVar132;
      auVar36._20_4_ = auVar14._20_4_ * fVar134;
      auVar36._24_4_ = auVar14._24_4_ * fVar136;
      auVar36._28_4_ = auVar14._28_4_;
      auVar12 = vfnmsub231ps_fma(auVar36,local_b80,auVar121);
      auVar121 = vsubps_avx(ZEXT832(0) << 0x20,auVar19);
      auVar108 = vfnmadd231ps_fma(ZEXT1632(auVar12),local_b60,auVar121);
      auVar37._4_4_ = fVar298 * (float)local_940._4_4_;
      auVar37._0_4_ = fVar225 * (float)local_940._0_4_;
      auVar37._8_4_ = fVar251 * fStack_938;
      auVar37._12_4_ = fVar252 * fStack_934;
      auVar37._16_4_ = fVar132 * fStack_930;
      auVar37._20_4_ = fVar134 * fStack_92c;
      auVar37._24_4_ = fVar136 * fStack_928;
      auVar37._28_4_ = auVar121._28_4_;
      auVar12 = vfnmsub231ps_fma(auVar37,_local_8e0,local_b80);
      auVar115 = vfnmadd231ps_fma(ZEXT1632(auVar12),_local_8c0,local_b60);
      auVar250 = ZEXT1664(auVar115);
      auVar121 = vandps_avx(ZEXT1632(auVar115),auVar67);
      auVar19 = vrcpps_avx(ZEXT1632(auVar115));
      auVar182._8_4_ = 0x219392ef;
      auVar182._0_8_ = 0x219392ef219392ef;
      auVar182._12_4_ = 0x219392ef;
      auVar182._16_4_ = 0x219392ef;
      auVar182._20_4_ = 0x219392ef;
      auVar182._24_4_ = 0x219392ef;
      auVar182._28_4_ = 0x219392ef;
      auVar14 = vcmpps_avx(auVar121,auVar182,1);
      auVar291 = ZEXT3264(auVar14);
      auVar248 = ZEXT1632(auVar115);
      auVar12 = vfnmadd213ps_fma(auVar19,auVar248,auVar308);
      auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar19,auVar19);
      auVar294._0_4_ = auVar115._0_4_ ^ local_7a0;
      auVar294._4_4_ = auVar115._4_4_ ^ uStack_79c;
      auVar294._8_4_ = auVar115._8_4_ ^ uStack_798;
      auVar294._12_4_ = auVar115._12_4_ ^ uStack_794;
      auVar294._16_4_ = fStack_790;
      auVar294._20_4_ = fStack_78c;
      auVar294._24_4_ = fStack_788;
      auVar294._28_4_ = uStack_784;
      auVar297 = ZEXT3264(auVar294);
      auVar38._4_4_ = auVar12._4_4_ * (float)(auVar108._4_4_ ^ uStack_79c);
      auVar38._0_4_ = auVar12._0_4_ * (float)(auVar108._0_4_ ^ local_7a0);
      auVar38._8_4_ = auVar12._8_4_ * (float)(auVar108._8_4_ ^ uStack_798);
      auVar38._12_4_ = auVar12._12_4_ * (float)(auVar108._12_4_ ^ uStack_794);
      auVar38._16_4_ = fStack_790 * 0.0;
      auVar38._20_4_ = fStack_78c * 0.0;
      auVar38._24_4_ = fStack_788 * 0.0;
      auVar38._28_4_ = uStack_784;
      auVar121 = vcmpps_avx(auVar248,auVar294,1);
      auVar121 = vorps_avx(auVar14,auVar121);
      auVar156._8_4_ = 0xff800000;
      auVar156._0_8_ = 0xff800000ff800000;
      auVar156._12_4_ = 0xff800000;
      auVar156._16_4_ = 0xff800000;
      auVar156._20_4_ = 0xff800000;
      auVar156._24_4_ = 0xff800000;
      auVar156._28_4_ = 0xff800000;
      auVar121 = vblendvps_avx(auVar38,auVar156,auVar121);
      _local_920 = vmaxps_avx(auVar260,auVar121);
      auVar121 = vcmpps_avx(auVar248,auVar294,6);
      auVar121 = vorps_avx(auVar14,auVar121);
      auVar209._8_4_ = 0x7f800000;
      auVar209._0_8_ = 0x7f8000007f800000;
      auVar209._12_4_ = 0x7f800000;
      auVar209._16_4_ = 0x7f800000;
      auVar209._20_4_ = 0x7f800000;
      auVar209._24_4_ = 0x7f800000;
      auVar209._28_4_ = 0x7f800000;
      auVar121 = vblendvps_avx(auVar38,auVar209,auVar121);
      auVar120 = vandps_avx(auVar120,local_240);
      auVar224 = ZEXT3264(auVar120);
      local_2a0 = vminps_avx(auVar274,auVar121);
      auVar121 = vcmpps_avx(_local_920,local_2a0,2);
      auVar14 = auVar120 & auVar121;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar297 = ZEXT3264(auVar308);
        auVar14 = vminps_avx(local_680,auVar308);
        auVar53 = ZEXT812(0);
        auVar190 = ZEXT1264(auVar53) << 0x20;
        auVar14 = vmaxps_avx(auVar14,ZEXT1232(auVar53) << 0x20);
        auVar260 = vminps_avx(local_6a0,auVar308);
        auVar260 = vmaxps_avx(auVar260,ZEXT1232(auVar53) << 0x20);
        auVar39._4_4_ = (auVar14._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar14._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar14._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar14._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar14._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar14._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar14._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar14._28_4_ + 7.0;
        auVar12 = vfmadd213ps_fma(auVar39,local_a40,local_ac0);
        auVar40._4_4_ = (auVar260._4_4_ + 1.0) * 0.125;
        auVar40._0_4_ = (auVar260._0_4_ + 0.0) * 0.125;
        auVar40._8_4_ = (auVar260._8_4_ + 2.0) * 0.125;
        auVar40._12_4_ = (auVar260._12_4_ + 3.0) * 0.125;
        auVar40._16_4_ = (auVar260._16_4_ + 4.0) * 0.125;
        auVar40._20_4_ = (auVar260._20_4_ + 5.0) * 0.125;
        auVar40._24_4_ = (auVar260._24_4_ + 6.0) * 0.125;
        auVar40._28_4_ = auVar260._28_4_ + 7.0;
        auVar108 = vfmadd213ps_fma(auVar40,local_a40,local_ac0);
        auVar14 = vminps_avx(local_820,local_840);
        auVar260 = vminps_avx(local_860,auVar20);
        auVar14 = vminps_avx(auVar14,auVar260);
        auVar125 = vsubps_avx(auVar14,auVar125);
        auVar120 = vandps_avx(auVar121,auVar120);
        auVar224 = ZEXT3264(auVar120);
        local_680 = ZEXT1632(auVar12);
        local_6a0 = ZEXT1632(auVar108);
        auVar41._4_4_ = auVar125._4_4_ * 0.99999976;
        auVar41._0_4_ = auVar125._0_4_ * 0.99999976;
        auVar41._8_4_ = auVar125._8_4_ * 0.99999976;
        auVar41._12_4_ = auVar125._12_4_ * 0.99999976;
        auVar41._16_4_ = auVar125._16_4_ * 0.99999976;
        auVar41._20_4_ = auVar125._20_4_ * 0.99999976;
        auVar41._24_4_ = auVar125._24_4_ * 0.99999976;
        auVar41._28_4_ = auVar125._28_4_;
        auVar125 = vmaxps_avx(ZEXT832(0) << 0x20,auVar41);
        auVar42._4_4_ = auVar125._4_4_ * auVar125._4_4_;
        auVar42._0_4_ = auVar125._0_4_ * auVar125._0_4_;
        auVar42._8_4_ = auVar125._8_4_ * auVar125._8_4_;
        auVar42._12_4_ = auVar125._12_4_ * auVar125._12_4_;
        auVar42._16_4_ = auVar125._16_4_ * auVar125._16_4_;
        auVar42._20_4_ = auVar125._20_4_ * auVar125._20_4_;
        auVar42._24_4_ = auVar125._24_4_ * auVar125._24_4_;
        auVar42._28_4_ = auVar125._28_4_;
        auVar121 = vsubps_avx(auVar17,auVar42);
        auVar43._4_4_ = auVar121._4_4_ * fVar227 * 4.0;
        auVar43._0_4_ = auVar121._0_4_ * fVar228 * 4.0;
        auVar43._8_4_ = auVar121._8_4_ * fVar229 * 4.0;
        auVar43._12_4_ = auVar121._12_4_ * fVar105 * 4.0;
        auVar43._16_4_ = auVar121._16_4_ * fVar133 * 4.0;
        auVar43._20_4_ = auVar121._20_4_ * fVar135 * 4.0;
        auVar43._24_4_ = auVar121._24_4_ * fVar137 * 4.0;
        auVar43._28_4_ = auVar125._28_4_;
        auVar14 = vsubps_avx(auVar30,auVar43);
        auVar291 = ZEXT3264(auVar14);
        auVar125 = vcmpps_avx(auVar14,ZEXT1232(auVar53) << 0x20,5);
        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0x7f,0) == '\0') &&
              (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar125 >> 0xbf,0) == '\0') &&
            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar125[0x1f]) {
          auVar124 = SUB6432(ZEXT864(0),0) << 0x20;
          local_9a0 = ZEXT832(0) << 0x20;
          _local_7e0 = ZEXT832(0) << 0x20;
          auVar157 = ZEXT832(0) << 0x20;
          auVar249._8_4_ = 0x7f800000;
          auVar249._0_8_ = 0x7f8000007f800000;
          auVar249._12_4_ = 0x7f800000;
          auVar249._16_4_ = 0x7f800000;
          auVar249._20_4_ = 0x7f800000;
          auVar249._24_4_ = 0x7f800000;
          auVar249._28_4_ = 0x7f800000;
          auVar258._8_4_ = 0xff800000;
          auVar258._0_8_ = 0xff800000ff800000;
          auVar258._12_4_ = 0xff800000;
          auVar258._16_4_ = 0xff800000;
          auVar258._20_4_ = 0xff800000;
          auVar258._24_4_ = 0xff800000;
          auVar258._28_4_ = 0xff800000;
          local_980 = local_9a0;
        }
        else {
          auVar274 = vsqrtps_avx(auVar14);
          auVar259._0_4_ = fVar228 + fVar228;
          auVar259._4_4_ = fVar227 + fVar227;
          auVar259._8_4_ = fVar229 + fVar229;
          auVar259._12_4_ = fVar105 + fVar105;
          auVar259._16_4_ = fVar133 + fVar133;
          auVar259._20_4_ = fVar135 + fVar135;
          auVar259._24_4_ = fVar137 + fVar137;
          auVar259._28_4_ = fVar212 + fVar212;
          auVar260 = vrcpps_avx(auVar259);
          auVar12 = vfnmadd213ps_fma(auVar259,auVar260,auVar308);
          auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar260,auVar260);
          auVar295._0_4_ = (uint)auVar301._0_4_ ^ local_7a0;
          auVar295._4_4_ = (uint)auVar301._4_4_ ^ uStack_79c;
          auVar295._8_4_ = (uint)auVar301._8_4_ ^ uStack_798;
          auVar295._12_4_ = (uint)auVar301._12_4_ ^ uStack_794;
          auVar295._16_4_ = (uint)auVar301._16_4_ ^ (uint)fStack_790;
          auVar295._20_4_ = (uint)auVar301._20_4_ ^ (uint)fStack_78c;
          auVar295._24_4_ = (uint)auVar301._24_4_ ^ (uint)fStack_788;
          auVar295._28_4_ = (uint)auVar301._28_4_ ^ uStack_784;
          auVar260 = vsubps_avx(auVar295,auVar274);
          auVar19 = vsubps_avx(auVar274,auVar301);
          fVar225 = auVar260._0_4_ * auVar12._0_4_;
          fVar228 = auVar260._4_4_ * auVar12._4_4_;
          auVar44._4_4_ = fVar228;
          auVar44._0_4_ = fVar225;
          fVar298 = auVar260._8_4_ * auVar12._8_4_;
          auVar44._8_4_ = fVar298;
          fVar227 = auVar260._12_4_ * auVar12._12_4_;
          auVar44._12_4_ = fVar227;
          fVar251 = auVar260._16_4_ * 0.0;
          auVar44._16_4_ = fVar251;
          fVar229 = auVar260._20_4_ * 0.0;
          auVar44._20_4_ = fVar229;
          fVar252 = auVar260._24_4_ * 0.0;
          auVar44._24_4_ = fVar252;
          auVar44._28_4_ = auVar274._28_4_;
          fVar105 = auVar19._0_4_ * auVar12._0_4_;
          fVar132 = auVar19._4_4_ * auVar12._4_4_;
          auVar45._4_4_ = fVar132;
          auVar45._0_4_ = fVar105;
          fVar133 = auVar19._8_4_ * auVar12._8_4_;
          auVar45._8_4_ = fVar133;
          fVar134 = auVar19._12_4_ * auVar12._12_4_;
          auVar45._12_4_ = fVar134;
          fVar135 = auVar19._16_4_ * 0.0;
          auVar45._16_4_ = fVar135;
          fVar136 = auVar19._20_4_ * 0.0;
          auVar45._20_4_ = fVar136;
          fVar137 = auVar19._24_4_ * 0.0;
          auVar45._24_4_ = fVar137;
          auVar45._28_4_ = auVar260._28_4_;
          auVar297 = ZEXT3264(auVar45);
          auVar12 = vfmadd213ps_fma(auVar284,auVar44,auVar273);
          auVar108 = vfmadd213ps_fma(auVar284,auVar45,auVar273);
          auVar260 = ZEXT1632(CONCAT412(fVar265 * auVar12._12_4_,
                                        CONCAT48(fVar264 * auVar12._8_4_,
                                                 CONCAT44(fVar299 * auVar12._4_4_,
                                                          fVar226 * auVar12._0_4_))));
          auVar274 = ZEXT1632(CONCAT412(fVar265 * auVar108._12_4_,
                                        CONCAT48(fVar264 * auVar108._8_4_,
                                                 CONCAT44(fVar299 * auVar108._4_4_,
                                                          fVar226 * auVar108._0_4_))));
          auVar12 = vfmadd213ps_fma(auVar16,auVar260,auVar307);
          auVar108 = vfmadd213ps_fma(auVar16,auVar274,auVar307);
          auVar115 = vfmadd213ps_fma(auVar157,auVar260,auVar300);
          auVar139 = vfmadd213ps_fma(auVar157,auVar274,auVar300);
          auVar107 = vfmadd213ps_fma(auVar260,auVar124,auVar181);
          auVar140 = vfmadd213ps_fma(auVar124,auVar274,auVar181);
          auVar46._4_4_ = (float)local_8c0._4_4_ * fVar228;
          auVar46._0_4_ = (float)local_8c0._0_4_ * fVar225;
          auVar46._8_4_ = fStack_8b8 * fVar298;
          auVar46._12_4_ = fStack_8b4 * fVar227;
          auVar46._16_4_ = fStack_8b0 * fVar251;
          auVar46._20_4_ = fStack_8ac * fVar229;
          auVar46._24_4_ = fStack_8a8 * fVar252;
          auVar46._28_4_ = 0;
          auVar124 = vsubps_avx(auVar46,ZEXT1632(auVar12));
          auVar47._4_4_ = (float)local_8e0._4_4_ * fVar228;
          auVar47._0_4_ = (float)local_8e0._0_4_ * fVar225;
          auVar47._8_4_ = fStack_8d8 * fVar298;
          auVar47._12_4_ = fStack_8d4 * fVar227;
          auVar47._16_4_ = fStack_8d0 * fVar251;
          auVar47._20_4_ = fStack_8cc * fVar229;
          auVar47._24_4_ = fStack_8c8 * fVar252;
          auVar47._28_4_ = fVar212;
          auVar157 = vsubps_avx(auVar47,ZEXT1632(auVar115));
          auVar183._0_4_ = (float)local_940._0_4_ * fVar225;
          auVar183._4_4_ = (float)local_940._4_4_ * fVar228;
          auVar183._8_4_ = fStack_938 * fVar298;
          auVar183._12_4_ = fStack_934 * fVar227;
          auVar183._16_4_ = fStack_930 * fVar251;
          auVar183._20_4_ = fStack_92c * fVar229;
          auVar183._24_4_ = fStack_928 * fVar252;
          auVar183._28_4_ = 0;
          auVar16 = vsubps_avx(auVar183,ZEXT1632(auVar107));
          auVar190 = ZEXT3264(auVar16);
          auVar261._0_4_ = (float)local_8c0._0_4_ * fVar105;
          auVar261._4_4_ = (float)local_8c0._4_4_ * fVar132;
          auVar261._8_4_ = fStack_8b8 * fVar133;
          auVar261._12_4_ = fStack_8b4 * fVar134;
          auVar261._16_4_ = fStack_8b0 * fVar135;
          auVar261._20_4_ = fStack_8ac * fVar136;
          auVar261._24_4_ = fStack_8a8 * fVar137;
          auVar261._28_4_ = 0;
          local_980 = vsubps_avx(auVar261,ZEXT1632(auVar108));
          auVar48._4_4_ = (float)local_8e0._4_4_ * fVar132;
          auVar48._0_4_ = (float)local_8e0._0_4_ * fVar105;
          auVar48._8_4_ = fStack_8d8 * fVar133;
          auVar48._12_4_ = fStack_8d4 * fVar134;
          auVar48._16_4_ = fStack_8d0 * fVar135;
          auVar48._20_4_ = fStack_8cc * fVar136;
          auVar48._24_4_ = fStack_8c8 * fVar137;
          auVar48._28_4_ = local_980._28_4_;
          local_9a0 = vsubps_avx(auVar48,ZEXT1632(auVar139));
          auVar49._4_4_ = (float)local_940._4_4_ * fVar132;
          auVar49._0_4_ = (float)local_940._0_4_ * fVar105;
          auVar49._8_4_ = fStack_938 * fVar133;
          auVar49._12_4_ = fStack_934 * fVar134;
          auVar49._16_4_ = fStack_930 * fVar135;
          auVar49._20_4_ = fStack_92c * fVar136;
          auVar49._24_4_ = fStack_928 * fVar137;
          auVar49._28_4_ = local_9a0._28_4_;
          _local_7e0 = vsubps_avx(auVar49,ZEXT1632(auVar140));
          auVar16 = vcmpps_avx(auVar14,_DAT_02020f00,5);
          auVar262._8_4_ = 0x7f800000;
          auVar262._0_8_ = 0x7f8000007f800000;
          auVar262._12_4_ = 0x7f800000;
          auVar262._16_4_ = 0x7f800000;
          auVar262._20_4_ = 0x7f800000;
          auVar262._24_4_ = 0x7f800000;
          auVar262._28_4_ = 0x7f800000;
          auVar249 = vblendvps_avx(auVar262,auVar44,auVar16);
          auVar68._4_4_ = uStack_95c;
          auVar68._0_4_ = local_960;
          auVar68._8_4_ = uStack_958;
          auVar68._12_4_ = uStack_954;
          auVar68._16_4_ = uStack_950;
          auVar68._20_4_ = uStack_94c;
          auVar68._24_4_ = uStack_948;
          auVar68._28_4_ = uStack_944;
          auVar14 = vandps_avx(auVar68,local_ae0);
          auVar14 = vmaxps_avx(local_5c0,auVar14);
          auVar291 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar50._4_4_ = auVar14._4_4_ * 1.9073486e-06;
          auVar50._0_4_ = auVar14._0_4_ * 1.9073486e-06;
          auVar50._8_4_ = auVar14._8_4_ * 1.9073486e-06;
          auVar50._12_4_ = auVar14._12_4_ * 1.9073486e-06;
          auVar50._16_4_ = auVar14._16_4_ * 1.9073486e-06;
          auVar50._20_4_ = auVar14._20_4_ * 1.9073486e-06;
          auVar50._24_4_ = auVar14._24_4_ * 1.9073486e-06;
          auVar50._28_4_ = auVar14._28_4_;
          auVar14 = vandps_avx(auVar68,local_620);
          auVar14 = vcmpps_avx(auVar14,auVar50,1);
          auVar285 = ZEXT3264(auVar14);
          auVar263._8_4_ = 0xff800000;
          auVar263._0_8_ = 0xff800000ff800000;
          auVar263._12_4_ = 0xff800000;
          auVar263._16_4_ = 0xff800000;
          auVar263._20_4_ = 0xff800000;
          auVar263._24_4_ = 0xff800000;
          auVar263._28_4_ = 0xff800000;
          auVar258 = vblendvps_avx(auVar263,auVar45,auVar16);
          auVar260 = auVar16 & auVar14;
          if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar260 >> 0x7f,0) != '\0') ||
                (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar260 >> 0xbf,0) != '\0') ||
              (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar260[0x1f] < '\0') {
            auVar125 = vandps_avx(auVar14,auVar16);
            auVar14 = vcmpps_avx(auVar121,ZEXT832(0) << 0x20,2);
            auVar296._8_4_ = 0xff800000;
            auVar296._0_8_ = 0xff800000ff800000;
            auVar296._12_4_ = 0xff800000;
            auVar296._16_4_ = 0xff800000;
            auVar296._20_4_ = 0xff800000;
            auVar296._24_4_ = 0xff800000;
            auVar296._28_4_ = 0xff800000;
            auVar297 = ZEXT3264(auVar296);
            auVar304._8_4_ = 0x7f800000;
            auVar304._0_8_ = 0x7f8000007f800000;
            auVar304._12_4_ = 0x7f800000;
            auVar304._16_4_ = 0x7f800000;
            auVar304._20_4_ = 0x7f800000;
            auVar304._24_4_ = 0x7f800000;
            auVar304._28_4_ = 0x7f800000;
            auVar121 = vblendvps_avx(auVar304,auVar296,auVar14);
            auVar12 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
            auVar260 = vpmovsxwd_avx2(auVar12);
            auVar285 = ZEXT3264(auVar260);
            auVar249 = vblendvps_avx(auVar249,auVar121,auVar260);
            auVar121 = vblendvps_avx(auVar296,auVar304,auVar14);
            auVar291 = ZEXT3264(auVar121);
            auVar258 = vblendvps_avx(auVar258,auVar121,auVar260);
            auVar239._0_8_ = auVar125._0_8_ ^ 0xffffffffffffffff;
            auVar239._8_4_ = auVar125._8_4_ ^ 0xffffffff;
            auVar239._12_4_ = auVar125._12_4_ ^ 0xffffffff;
            auVar239._16_4_ = auVar125._16_4_ ^ 0xffffffff;
            auVar239._20_4_ = auVar125._20_4_ ^ 0xffffffff;
            auVar239._24_4_ = auVar125._24_4_ ^ 0xffffffff;
            auVar239._28_4_ = auVar125._28_4_ ^ 0xffffffff;
            auVar125 = vorps_avx(auVar14,auVar239);
            auVar125 = vandps_avx(auVar16,auVar125);
          }
        }
        auVar275 = ZEXT3264(_local_920);
        local_420 = _local_920;
        local_400 = vminps_avx(local_2a0,auVar249);
        auVar14 = vmaxps_avx(_local_920,auVar258);
        _local_2c0 = auVar14;
        auVar121 = vcmpps_avx(_local_920,local_400,2);
        local_6c0 = vandps_avx(auVar121,auVar120);
        auVar121 = vcmpps_avx(auVar14,local_2a0,2);
        local_780 = vandps_avx(auVar121,auVar120);
        auVar250 = ZEXT3264(local_780);
        auVar120 = vorps_avx(local_780,local_6c0);
        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0x7f,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar120 >> 0xbf,0) != '\0') ||
            (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar120[0x1f] < '\0') {
          local_720._0_8_ = auVar125._0_8_ ^ 0xffffffffffffffff;
          local_720._8_4_ = auVar125._8_4_ ^ 0xffffffff;
          local_720._12_4_ = auVar125._12_4_ ^ 0xffffffff;
          local_720._16_4_ = auVar125._16_4_ ^ 0xffffffff;
          local_720._20_4_ = auVar125._20_4_ ^ 0xffffffff;
          local_720._24_4_ = auVar125._24_4_ ^ 0xffffffff;
          local_720._28_4_ = auVar125._28_4_ ^ 0xffffffff;
          auVar224._0_4_ = auVar190._0_4_ * (float)local_940._0_4_;
          auVar224._4_4_ = auVar190._4_4_ * (float)local_940._4_4_;
          auVar224._8_4_ = auVar190._8_4_ * fStack_938;
          auVar224._12_4_ = auVar190._12_4_ * fStack_934;
          auVar224._16_4_ = auVar190._16_4_ * fStack_930;
          auVar224._20_4_ = auVar190._20_4_ * fStack_92c;
          auVar224._28_36_ = auVar190._28_36_;
          auVar224._24_4_ = auVar190._24_4_ * fStack_928;
          auVar12 = vfmadd132ps_fma(auVar157,auVar224._0_32_,_local_8e0);
          auVar12 = vfmadd132ps_fma(auVar124,ZEXT1632(auVar12),_local_8c0);
          auVar69._4_4_ = uStack_95c;
          auVar69._0_4_ = local_960;
          auVar69._8_4_ = uStack_958;
          auVar69._12_4_ = uStack_954;
          auVar69._16_4_ = uStack_950;
          auVar69._20_4_ = uStack_94c;
          auVar69._24_4_ = uStack_948;
          auVar69._28_4_ = uStack_944;
          auVar120 = vandps_avx(ZEXT1632(auVar12),auVar69);
          auVar158._8_4_ = 0x3e99999a;
          auVar158._0_8_ = 0x3e99999a3e99999a;
          auVar158._12_4_ = 0x3e99999a;
          auVar158._16_4_ = 0x3e99999a;
          auVar158._20_4_ = 0x3e99999a;
          auVar158._24_4_ = 0x3e99999a;
          auVar158._28_4_ = 0x3e99999a;
          auVar120 = vcmpps_avx(auVar120,auVar158,1);
          auVar120 = vorps_avx(auVar120,local_720);
          auVar159._8_4_ = 3;
          auVar159._0_8_ = 0x300000003;
          auVar159._12_4_ = 3;
          auVar159._16_4_ = 3;
          auVar159._20_4_ = 3;
          auVar159._24_4_ = 3;
          auVar159._28_4_ = 3;
          auVar184._8_4_ = 2;
          auVar184._0_8_ = 0x200000002;
          auVar184._12_4_ = 2;
          auVar184._16_4_ = 2;
          auVar184._20_4_ = 2;
          auVar184._24_4_ = 2;
          auVar184._28_4_ = 2;
          auVar120 = vblendvps_avx(auVar184,auVar159,auVar120);
          uVar100 = (undefined4)uVar101;
          local_740._4_4_ = uVar100;
          local_740._0_4_ = uVar100;
          local_740._8_4_ = uVar100;
          local_740._12_4_ = uVar100;
          local_740._16_4_ = uVar100;
          local_740._20_4_ = uVar100;
          local_740._24_4_ = uVar100;
          local_740._28_4_ = uVar100;
          local_6e0 = vpcmpgtd_avx2(auVar120,local_740);
          auVar120 = vpandn_avx2(local_6e0,local_6c0);
          auVar125 = local_6c0 & ~local_6e0;
          auStack_7b8 = auVar17._8_24_;
          local_7c0 = uVar101;
          fStack_bec = auVar11._4_4_;
          fStack_be8 = auVar11._8_4_;
          fStack_be4 = auVar11._12_4_;
          local_760 = auVar120;
          local_700 = local_780;
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar125 >> 0x7f,0) != '\0') ||
                (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar125 >> 0xbf,0) != '\0') ||
              (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar125[0x1f] < '\0') {
            auVar108 = vminps_avx(auVar13,auVar109);
            auVar12 = vmaxps_avx(auVar13,auVar109);
            auVar115 = vminps_avx(auVar10,auVar11);
            auVar139 = vminps_avx(auVar108,auVar115);
            auVar108 = vmaxps_avx(auVar10,auVar11);
            auVar115 = vmaxps_avx(auVar12,auVar108);
            auVar12 = vandps_avx(auVar139,local_a60);
            auVar108 = vandps_avx(auVar115,local_a60);
            auVar12 = vmaxps_avx(auVar12,auVar108);
            auVar108 = vmovshdup_avx(auVar12);
            auVar108 = vmaxss_avx(auVar108,auVar12);
            auVar12 = vshufpd_avx(auVar12,auVar12,1);
            auVar12 = vmaxss_avx(auVar12,auVar108);
            local_a20._4_24_ = auVar270._4_24_;
            local_a20._0_4_ = auVar12._0_4_ * 1.9073486e-06;
            local_a20._28_4_ = 0;
            local_8a0._0_16_ = vshufps_avx(auVar115,auVar115,0xff);
            local_8a0._16_16_ = auVar20._16_16_;
            local_900._4_4_ = (float)local_920._4_4_ + (float)local_880._4_4_;
            local_900._0_4_ = (float)local_920._0_4_ + (float)local_880._0_4_;
            fStack_8f8 = fStack_918 + fStack_878;
            fStack_8f4 = fStack_914 + fStack_874;
            fStack_8f0 = fStack_910 + fStack_870;
            fStack_8ec = fStack_90c + fStack_86c;
            fStack_8e8 = fStack_908 + fStack_868;
            fStack_8e4 = fStack_904 + fStack_864;
            do {
              auVar160._8_4_ = 0x7f800000;
              auVar160._0_8_ = 0x7f8000007f800000;
              auVar160._12_4_ = 0x7f800000;
              auVar160._16_4_ = 0x7f800000;
              auVar160._20_4_ = 0x7f800000;
              auVar160._24_4_ = 0x7f800000;
              auVar160._28_4_ = 0x7f800000;
              auVar125 = vblendvps_avx(auVar160,_local_920,auVar120);
              auVar121 = vshufps_avx(auVar125,auVar125,0xb1);
              auVar121 = vminps_avx(auVar125,auVar121);
              auVar16 = vshufpd_avx(auVar121,auVar121,5);
              auVar121 = vminps_avx(auVar121,auVar16);
              auVar16 = vpermpd_avx2(auVar121,0x4e);
              auVar121 = vminps_avx(auVar121,auVar16);
              auVar121 = vcmpps_avx(auVar125,auVar121,0);
              auVar16 = auVar120 & auVar121;
              auVar125 = auVar120;
              if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar16 >> 0x7f,0) != '\0') ||
                    (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0xbf,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar16[0x1f] < '\0') {
                auVar125 = vandps_avx(auVar121,auVar120);
              }
              uVar95 = vmovmskps_avx(auVar125);
              iVar94 = 0;
              for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
                iVar94 = iVar94 + 1;
              }
              uVar96 = iVar94 << 2;
              local_760 = auVar120;
              *(undefined4 *)(local_760 + uVar96) = 0;
              uVar95 = *(uint *)(local_680 + uVar96);
              uVar96 = *(uint *)(local_420 + uVar96);
              fVar212 = auVar8._0_4_;
              if ((float)local_a70._0_4_ < 0.0) {
                fVar212 = sqrtf((float)local_a70._0_4_);
              }
              auVar285 = ZEXT464(uVar96);
              auVar275 = ZEXT464(uVar95);
              local_ae0._0_4_ = fVar212 * 1.9073486e-06;
              lVar102 = 4;
              do {
                fVar227 = auVar275._0_4_;
                fVar299 = 1.0 - fVar227;
                local_b40._0_16_ = ZEXT416((uint)fVar299);
                fVar228 = fVar299 * fVar299 * fVar299;
                fVar298 = fVar227 * fVar227;
                fVar226 = fVar227 * fVar298;
                auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar228),
                                           ZEXT416((uint)fVar226));
                fVar225 = fVar227 * fVar299;
                auVar115 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar225 * 6.0)),
                                           ZEXT416((uint)(fVar299 * fVar225)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar299 * fVar225 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar227 * fVar225)));
                auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar226),
                                          ZEXT416((uint)fVar228));
                fVar212 = (auVar12._0_4_ + auVar139._0_4_) * 0.16666667;
                fVar226 = fVar226 * 0.16666667;
                auVar141._0_4_ = fVar226 * fVar131;
                auVar141._4_4_ = fVar226 * fStack_bec;
                auVar141._8_4_ = fVar226 * fStack_be8;
                auVar141._12_4_ = fVar226 * fStack_be4;
                auVar194._4_4_ = fVar212;
                auVar194._0_4_ = fVar212;
                auVar194._8_4_ = fVar212;
                auVar194._12_4_ = fVar212;
                auVar12 = vfmadd132ps_fma(auVar194,auVar141,auVar10);
                fVar212 = (auVar108._0_4_ + auVar115._0_4_) * 0.16666667;
                auVar142._4_4_ = fVar212;
                auVar142._0_4_ = fVar212;
                auVar142._8_4_ = fVar212;
                auVar142._12_4_ = fVar212;
                auVar12 = vfmadd132ps_fma(auVar142,auVar12,auVar109);
                fVar212 = auVar285._0_4_;
                auVar171._4_4_ = fVar212;
                auVar171._0_4_ = fVar212;
                auVar171._8_4_ = fVar212;
                auVar171._12_4_ = fVar212;
                auVar108 = vfmadd213ps_fma(auVar171,local_a50,_DAT_01feba10);
                fVar228 = fVar228 * 0.16666667;
                auVar110._4_4_ = fVar228;
                auVar110._0_4_ = fVar228;
                auVar110._8_4_ = fVar228;
                auVar110._12_4_ = fVar228;
                auVar12 = vfmadd132ps_fma(auVar110,auVar12,auVar13);
                local_800._0_16_ = auVar12;
                auVar12 = vsubps_avx(auVar108,auVar12);
                _local_b20 = auVar12;
                auVar12 = vdpps_avx(auVar12,auVar12,0x7f);
                fVar226 = auVar12._0_4_;
                auVar108 = auVar275._0_16_;
                if (fVar226 < 0.0) {
                  local_b40._0_16_ = ZEXT416((uint)fVar299);
                  local_b60._0_4_ = fVar298;
                  local_aa0._0_4_ = fVar225;
                  auVar250._0_4_ = sqrtf(fVar226);
                  auVar250._4_60_ = extraout_var;
                  auVar115 = auVar250._0_16_;
                  fVar225 = (float)local_aa0._0_4_;
                  fVar298 = (float)local_b60._0_4_;
                }
                else {
                  auVar115 = vsqrtss_avx(auVar12,auVar12);
                }
                fVar228 = local_b40._0_4_;
                auVar111._4_4_ = fVar228;
                auVar111._0_4_ = fVar228;
                auVar111._8_4_ = fVar228;
                auVar111._12_4_ = fVar228;
                auVar107 = vfnmsub213ss_fma(auVar108,auVar108,ZEXT416((uint)(fVar225 * 4.0)));
                auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * 4.0)),local_b40._0_16_,
                                           local_b40._0_16_);
                fVar225 = fVar228 * -fVar228 * 0.5;
                fVar228 = auVar107._0_4_ * 0.5;
                fVar299 = auVar139._0_4_ * 0.5;
                fVar298 = fVar298 * 0.5;
                auVar234._0_4_ = fVar131 * fVar298;
                auVar234._4_4_ = fStack_bec * fVar298;
                auVar234._8_4_ = fStack_be8 * fVar298;
                auVar234._12_4_ = fStack_be4 * fVar298;
                auVar195._4_4_ = fVar299;
                auVar195._0_4_ = fVar299;
                auVar195._8_4_ = fVar299;
                auVar195._12_4_ = fVar299;
                auVar139 = vfmadd213ps_fma(auVar195,auVar10,auVar234);
                auVar215._4_4_ = fVar228;
                auVar215._0_4_ = fVar228;
                auVar215._8_4_ = fVar228;
                auVar215._12_4_ = fVar228;
                auVar139 = vfmadd213ps_fma(auVar215,auVar109,auVar139);
                auVar288._4_4_ = fVar225;
                auVar288._0_4_ = fVar225;
                auVar288._8_4_ = fVar225;
                auVar288._12_4_ = fVar225;
                auVar140 = vfmadd213ps_fma(auVar288,auVar13,auVar139);
                auVar139 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_b40._0_16_,auVar108)
                ;
                auVar108 = vfmadd231ss_fma(local_b40._0_16_,auVar108,SUB6416(ZEXT464(0xc0000000),0))
                ;
                auVar196._0_4_ = fVar131 * fVar227;
                auVar196._4_4_ = fStack_bec * fVar227;
                auVar196._8_4_ = fStack_be8 * fVar227;
                auVar196._12_4_ = fStack_be4 * fVar227;
                uVar100 = auVar108._0_4_;
                auVar216._4_4_ = uVar100;
                auVar216._0_4_ = uVar100;
                auVar216._8_4_ = uVar100;
                auVar216._12_4_ = uVar100;
                auVar108 = vfmadd213ps_fma(auVar216,auVar10,auVar196);
                auVar172._0_4_ = auVar139._0_4_;
                auVar172._4_4_ = auVar172._0_4_;
                auVar172._8_4_ = auVar172._0_4_;
                auVar172._12_4_ = auVar172._0_4_;
                auVar108 = vfmadd213ps_fma(auVar172,auVar109,auVar108);
                auVar148 = vfmadd231ps_fma(auVar108,auVar13,auVar111);
                auVar139 = vdpps_avx(auVar140,auVar140,0x7f);
                auVar108 = vblendps_avx(auVar139,_DAT_01feba10,0xe);
                auVar107 = vrsqrtss_avx(auVar108,auVar108);
                fVar225 = auVar107._0_4_;
                fVar298 = auVar139._0_4_;
                fVar225 = fVar225 * 1.5 + fVar298 * -0.5 * fVar225 * fVar225 * fVar225;
                auVar107 = vdpps_avx(auVar140,auVar148,0x7f);
                auVar173._0_4_ = auVar148._0_4_ * fVar298;
                auVar173._4_4_ = auVar148._4_4_ * fVar298;
                auVar173._8_4_ = auVar148._8_4_ * fVar298;
                auVar173._12_4_ = auVar148._12_4_ * fVar298;
                fVar228 = auVar107._0_4_;
                auVar235._0_4_ = auVar140._0_4_ * fVar228;
                auVar235._4_4_ = auVar140._4_4_ * fVar228;
                fVar299 = auVar140._8_4_;
                auVar235._8_4_ = fVar299 * fVar228;
                fVar251 = auVar140._12_4_;
                auVar235._12_4_ = fVar251 * fVar228;
                auVar107 = vsubps_avx(auVar173,auVar235);
                auVar108 = vrcpss_avx(auVar108,auVar108);
                auVar148 = vfnmadd213ss_fma(auVar108,auVar139,ZEXT416(0x40000000));
                fVar228 = auVar108._0_4_ * auVar148._0_4_;
                auVar108 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                      ZEXT416((uint)(fVar212 * (float)local_ae0._0_4_)));
                local_b80._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
                local_b80._8_4_ = -fVar299;
                local_b80._12_4_ = -fVar251;
                auVar197._0_4_ = fVar225 * auVar107._0_4_ * fVar228;
                auVar197._4_4_ = fVar225 * auVar107._4_4_ * fVar228;
                auVar197._8_4_ = fVar225 * auVar107._8_4_ * fVar228;
                auVar197._12_4_ = fVar225 * auVar107._12_4_ * fVar228;
                auVar244._0_4_ = auVar140._0_4_ * fVar225;
                auVar244._4_4_ = auVar140._4_4_ * fVar225;
                auVar244._8_4_ = fVar299 * fVar225;
                auVar244._12_4_ = fVar251 * fVar225;
                local_b40._0_16_ = auVar140;
                local_b60._0_4_ = auVar108._0_4_;
                if (fVar298 < -fVar298) {
                  local_aa0._0_4_ = auVar115._0_4_;
                  local_ac0._0_16_ = auVar244;
                  local_a40._0_16_ = auVar197;
                  fVar225 = sqrtf(fVar298);
                  auVar108 = ZEXT416((uint)local_b60._0_4_);
                  auVar115 = ZEXT416((uint)local_aa0._0_4_);
                  auVar197 = local_a40._0_16_;
                  auVar244 = local_ac0._0_16_;
                }
                else {
                  auVar139 = vsqrtss_avx(auVar139,auVar139);
                  fVar225 = auVar139._0_4_;
                }
                auVar139 = vdpps_avx(_local_b20,auVar244,0x7f);
                auVar148 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar115,auVar108);
                auVar107 = vdpps_avx(local_b80._0_16_,auVar244,0x7f);
                auVar140 = vdpps_avx(_local_b20,auVar197,0x7f);
                local_aa0._0_16_ = vdpps_avx(local_a50,auVar244,0x7f);
                auVar148 = vfmadd213ss_fma(ZEXT416((uint)(auVar115._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_a20._0_4_ / fVar225)),
                                           auVar148);
                auVar297 = ZEXT1664(auVar148);
                fVar225 = auVar107._0_4_ + auVar140._0_4_;
                auVar112._0_4_ = auVar139._0_4_ * auVar139._0_4_;
                auVar112._4_4_ = auVar139._4_4_ * auVar139._4_4_;
                auVar112._8_4_ = auVar139._8_4_ * auVar139._8_4_;
                auVar112._12_4_ = auVar139._12_4_ * auVar139._12_4_;
                auVar115 = vdpps_avx(_local_b20,local_b80._0_16_,0x7f);
                auVar140 = vsubps_avx(auVar12,auVar112);
                auVar107 = vrsqrtss_avx(auVar140,auVar140);
                fVar298 = auVar140._0_4_;
                fVar228 = auVar107._0_4_;
                fVar228 = fVar228 * 1.5 + fVar298 * -0.5 * fVar228 * fVar228 * fVar228;
                auVar107 = vdpps_avx(_local_b20,local_a50,0x7f);
                local_b80._0_16_ = vfnmadd231ss_fma(auVar115,auVar139,ZEXT416((uint)fVar225));
                auVar115 = vfnmadd231ss_fma(auVar107,auVar139,local_aa0._0_16_);
                if (fVar298 < 0.0) {
                  local_ac0._0_16_ = auVar139;
                  local_a40._0_4_ = auVar148._0_4_;
                  local_820._0_16_ = ZEXT416((uint)fVar225);
                  local_840._0_4_ = fVar228;
                  local_860._0_16_ = auVar115;
                  fVar298 = sqrtf(fVar298);
                  auVar297 = ZEXT464((uint)local_a40._0_4_);
                  auVar108 = ZEXT416((uint)local_b60._0_4_);
                  fVar228 = (float)local_840._0_4_;
                  auVar115 = local_860._0_16_;
                  auVar139 = local_ac0._0_16_;
                  auVar107 = local_820._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar140,auVar140);
                  fVar298 = auVar107._0_4_;
                  auVar107 = ZEXT416((uint)fVar225);
                }
                auVar291 = ZEXT1664(local_b40._0_16_);
                auVar140 = vpermilps_avx(local_800._0_16_,0xff);
                auVar148 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xff);
                auVar214 = vfmsub213ss_fma(local_b80._0_16_,ZEXT416((uint)fVar228),auVar148);
                auVar250 = ZEXT1664(auVar214);
                auVar198._0_8_ = local_aa0._0_8_ ^ 0x8000000080000000;
                auVar198._8_4_ = local_aa0._8_4_ ^ 0x80000000;
                auVar198._12_4_ = local_aa0._12_4_ ^ 0x80000000;
                auVar217._0_8_ = auVar214._0_8_ ^ 0x8000000080000000;
                auVar217._8_4_ = auVar214._8_4_ ^ 0x80000000;
                auVar217._12_4_ = auVar214._12_4_ ^ 0x80000000;
                auVar115 = ZEXT416((uint)(auVar115._0_4_ * fVar228));
                auVar106 = vfmsub231ss_fma(ZEXT416((uint)(local_aa0._0_4_ * auVar214._0_4_)),
                                           auVar107,auVar115);
                auVar115 = vinsertps_avx(auVar115,auVar198,0x10);
                uVar100 = auVar106._0_4_;
                auVar199._4_4_ = uVar100;
                auVar199._0_4_ = uVar100;
                auVar199._8_4_ = uVar100;
                auVar199._12_4_ = uVar100;
                auVar115 = vdivps_avx(auVar115,auVar199);
                auVar106 = ZEXT416((uint)(fVar298 - auVar140._0_4_));
                auVar140 = vinsertps_avx(auVar139,auVar106,0x10);
                auVar174._0_4_ = auVar140._0_4_ * auVar115._0_4_;
                auVar174._4_4_ = auVar140._4_4_ * auVar115._4_4_;
                auVar174._8_4_ = auVar140._8_4_ * auVar115._8_4_;
                auVar174._12_4_ = auVar140._12_4_ * auVar115._12_4_;
                auVar115 = vinsertps_avx(auVar217,auVar107,0x1c);
                auVar115 = vdivps_avx(auVar115,auVar199);
                auVar200._0_4_ = auVar140._0_4_ * auVar115._0_4_;
                auVar200._4_4_ = auVar140._4_4_ * auVar115._4_4_;
                auVar200._8_4_ = auVar140._8_4_ * auVar115._8_4_;
                auVar200._12_4_ = auVar140._12_4_ * auVar115._12_4_;
                auVar115 = vhaddps_avx(auVar174,auVar174);
                auVar107 = vhaddps_avx(auVar200,auVar200);
                fVar227 = fVar227 - auVar115._0_4_;
                fVar212 = fVar212 - auVar107._0_4_;
                auVar285 = ZEXT464((uint)fVar212);
                auVar115 = vandps_avx(auVar139,local_a60);
                if (auVar297._0_4_ <= auVar115._0_4_) {
LAB_01708a9d:
                  bVar52 = false;
                }
                else {
                  auVar115 = vfmadd231ss_fma(ZEXT416((uint)(auVar108._0_4_ + auVar297._0_4_)),
                                             local_8a0._0_16_,ZEXT416(0x36000000));
                  auVar108 = vandps_avx(auVar106,local_a60);
                  if (auVar115._0_4_ <= auVar108._0_4_) goto LAB_01708a9d;
                  fVar212 = fVar212 + (float)local_9c0._0_4_;
                  auVar285 = ZEXT464((uint)fVar212);
                  bVar52 = true;
                  if ((((fVar104 <= fVar212) &&
                       (fVar225 = *(float *)(ray + k * 4 + 0x100), fVar212 <= fVar225)) &&
                      (0.0 <= fVar227)) && (fVar227 <= 1.0)) {
                    auVar12 = vrsqrtss_avx(auVar12,auVar12);
                    fVar228 = auVar12._0_4_;
                    auVar98 = (undefined1  [8])(context->scene->geometries).items[uVar93].ptr;
                    if ((((Geometry *)auVar98)->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar226 = fVar228 * 1.5 + fVar226 * -0.5 * fVar228 * fVar228 * fVar228;
                      auVar143._0_4_ = fVar226 * (float)local_b20._0_4_;
                      auVar143._4_4_ = fVar226 * (float)local_b20._4_4_;
                      auVar143._8_4_ = fVar226 * fStack_b18;
                      auVar143._12_4_ = fVar226 * fStack_b14;
                      auVar139 = vfmadd213ps_fma(auVar148,auVar143,local_b40._0_16_);
                      auVar12 = vshufps_avx(auVar143,auVar143,0xc9);
                      auVar108 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xc9);
                      auVar144._0_4_ = auVar143._0_4_ * auVar108._0_4_;
                      auVar144._4_4_ = auVar143._4_4_ * auVar108._4_4_;
                      auVar144._8_4_ = auVar143._8_4_ * auVar108._8_4_;
                      auVar144._12_4_ = auVar143._12_4_ * auVar108._12_4_;
                      auVar115 = vfmsub231ps_fma(auVar144,local_b40._0_16_,auVar12);
                      auVar12 = vshufps_avx(auVar115,auVar115,0xc9);
                      auVar108 = vshufps_avx(auVar139,auVar139,0xc9);
                      auVar115 = vshufps_avx(auVar115,auVar115,0xd2);
                      auVar113._0_4_ = auVar139._0_4_ * auVar115._0_4_;
                      auVar113._4_4_ = auVar139._4_4_ * auVar115._4_4_;
                      auVar113._8_4_ = auVar139._8_4_ * auVar115._8_4_;
                      auVar113._12_4_ = auVar139._12_4_ * auVar115._12_4_;
                      auVar12 = vfmsub231ps_fma(auVar113,auVar12,auVar108);
                      uVar100 = auVar12._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar98)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar212;
                        uVar4 = vextractps_avx(auVar12,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                        uVar4 = vextractps_avx(auVar12,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar100;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar227;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar3;
                        *(uint *)(ray + k * 4 + 0x240) = uVar93;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar7 = context->user;
                        auVar108 = vmovshdup_avx(auVar12);
                        auVar175._0_8_ = auVar108._0_8_;
                        auVar175._8_8_ = auVar175._0_8_;
                        auVar185._16_8_ = auVar175._0_8_;
                        auVar185._0_16_ = auVar175;
                        auVar185._24_8_ = auVar175._0_8_;
                        auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
                        local_3c0 = auVar12._0_8_;
                        local_3e0[0] = (RTCHitN)(char)auVar175._0_8_;
                        local_3e0[1] = (RTCHitN)SUB81(auVar175._0_8_,1);
                        local_3e0[2] = (RTCHitN)SUB81(auVar175._0_8_,2);
                        local_3e0[3] = (RTCHitN)SUB81(auVar175._0_8_,3);
                        local_3e0[4] = (RTCHitN)SUB81(auVar175._0_8_,4);
                        local_3e0[5] = (RTCHitN)SUB81(auVar175._0_8_,5);
                        local_3e0[6] = (RTCHitN)SUB81(auVar175._0_8_,6);
                        local_3e0[7] = (RTCHitN)SUB81(auVar175._0_8_,7);
                        local_3e0[8] = (RTCHitN)(char)auVar175._0_8_;
                        local_3e0[9] = (RTCHitN)SUB81(auVar175._0_8_,1);
                        local_3e0[10] = (RTCHitN)SUB81(auVar175._0_8_,2);
                        local_3e0[0xb] = (RTCHitN)SUB81(auVar175._0_8_,3);
                        local_3e0[0xc] = (RTCHitN)SUB81(auVar175._0_8_,4);
                        local_3e0[0xd] = (RTCHitN)SUB81(auVar175._0_8_,5);
                        local_3e0[0xe] = (RTCHitN)SUB81(auVar175._0_8_,6);
                        local_3e0[0xf] = (RTCHitN)SUB81(auVar175._0_8_,7);
                        local_3e0[0x10] = (RTCHitN)(char)auVar175._0_8_;
                        local_3e0[0x11] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 8);
                        local_3e0[0x12] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x10);
                        local_3e0[0x13] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x18);
                        local_3e0[0x14] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x20);
                        local_3e0[0x15] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x28);
                        local_3e0[0x16] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x30);
                        local_3e0[0x17] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x38);
                        local_3e0[0x18] = (RTCHitN)(char)auVar175._0_8_;
                        local_3e0[0x19] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 8);
                        local_3e0[0x1a] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x10);
                        local_3e0[0x1b] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x18);
                        local_3e0[0x1c] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x20);
                        local_3e0[0x1d] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x28);
                        local_3e0[0x1e] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x30);
                        local_3e0[0x1f] = (RTCHitN)(char)((ulong)auVar175._0_8_ >> 0x38);
                        uStack_3b8 = local_3c0;
                        uStack_3b0 = local_3c0;
                        uStack_3a8 = local_3c0;
                        local_3a0 = uVar100;
                        uStack_39c = uVar100;
                        uStack_398 = uVar100;
                        uStack_394 = uVar100;
                        uStack_390 = uVar100;
                        uStack_38c = uVar100;
                        uStack_388 = uVar100;
                        uStack_384 = uVar100;
                        local_380 = fVar227;
                        fStack_37c = fVar227;
                        fStack_378 = fVar227;
                        fStack_374 = fVar227;
                        fStack_370 = fVar227;
                        fStack_36c = fVar227;
                        fStack_368 = fVar227;
                        fStack_364 = fVar227;
                        auVar145._12_4_ = 0;
                        auVar145._0_12_ = ZEXT412(0);
                        auVar145 = auVar145 << 0x20;
                        local_360 = ZEXT1232(ZEXT412(0)) << 0x20;
                        local_340 = CONCAT44(uStack_5fc,local_600);
                        uStack_338 = CONCAT44(uStack_5f4,uStack_5f8);
                        uStack_330 = CONCAT44(uStack_5ec,uStack_5f0);
                        uStack_328 = CONCAT44(uStack_5e4,uStack_5e8);
                        local_320._4_4_ = uStack_5dc;
                        local_320._0_4_ = local_5e0;
                        local_320._8_4_ = uStack_5d8;
                        local_320._12_4_ = uStack_5d4;
                        local_320._16_4_ = uStack_5d0;
                        local_320._20_4_ = uStack_5cc;
                        local_320._24_4_ = uStack_5c8;
                        local_320._28_4_ = uStack_5c4;
                        auVar120 = vpcmpeqd_avx2(local_320,local_320);
                        local_ae8[1] = auVar120;
                        *local_ae8 = auVar120;
                        local_300 = pRVar7->instID[0];
                        uStack_2fc = local_300;
                        uStack_2f8 = local_300;
                        uStack_2f4 = local_300;
                        uStack_2f0 = local_300;
                        uStack_2ec = local_300;
                        uStack_2e8 = local_300;
                        uStack_2e4 = local_300;
                        local_2e0 = pRVar7->instPrimID[0];
                        uStack_2dc = local_2e0;
                        uStack_2d8 = local_2e0;
                        uStack_2d4 = local_2e0;
                        uStack_2d0 = local_2e0;
                        uStack_2cc = local_2e0;
                        uStack_2c8 = local_2e0;
                        uStack_2c4 = local_2e0;
                        *(float *)(ray + k * 4 + 0x100) = fVar212;
                        local_a00 = local_640._0_8_;
                        uStack_9f8 = local_640._8_8_;
                        uStack_9f0 = local_640._16_8_;
                        uStack_9e8 = local_640._24_8_;
                        local_bb0.valid = (int *)&local_a00;
                        local_bb0.geometryUserPtr = ((Geometry *)auVar98)->userPtr;
                        local_bb0.context = context->user;
                        local_bb0.hit = local_3e0;
                        local_bb0.N = 8;
                        local_bb0.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar98)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_b20 = auVar98;
                          auVar185 = ZEXT1632(auVar175);
                          auVar250 = ZEXT1664(auVar214);
                          auVar291 = ZEXT1664(local_b40._0_16_);
                          auVar297 = ZEXT1664(auVar297._0_16_);
                          (*((Geometry *)auVar98)->intersectionFilterN)(&local_bb0);
                          auVar145 = ZEXT816(0) << 0x40;
                          auVar98 = local_b20;
                        }
                        auVar120 = ZEXT1632(auVar145);
                        auVar60._8_8_ = uStack_9f8;
                        auVar60._0_8_ = local_a00;
                        auVar60._16_8_ = uStack_9f0;
                        auVar60._24_8_ = uStack_9e8;
                        auVar125 = vpcmpeqd_avx2(auVar120,auVar60);
                        auVar121 = vpcmpeqd_avx2(auVar120,auVar120);
                        auVar120 = auVar121 & ~auVar125;
                        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar120 >> 0x7f,0) == '\0')
                              && (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar120 >> 0xbf,0) == '\0') &&
                            (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar120[0x1f]) {
                          auVar125 = auVar125 ^ auVar121;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar98)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar185 = ZEXT1632(auVar185._0_16_);
                            auVar250 = ZEXT1664(auVar250._0_16_);
                            auVar291 = ZEXT1664(auVar291._0_16_);
                            auVar297 = ZEXT1664(auVar297._0_16_);
                            (*p_Var6)(&local_bb0);
                          }
                          auVar61._8_8_ = uStack_9f8;
                          auVar61._0_8_ = local_a00;
                          auVar61._16_8_ = uStack_9f0;
                          auVar61._24_8_ = uStack_9e8;
                          auVar121 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar61);
                          auVar16 = vpcmpeqd_avx2(auVar185,auVar185);
                          auVar125 = auVar121 ^ auVar16;
                          auVar120 = auVar16 & ~auVar121;
                          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar120 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar120 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar120 >> 0x7f,0) != '\0') ||
                                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar120 >> 0xbf,0) != '\0') ||
                              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar120[0x1f] < '\0') {
                            auVar161._0_4_ = auVar121._0_4_ ^ auVar16._0_4_;
                            auVar161._4_4_ = auVar121._4_4_ ^ auVar16._4_4_;
                            auVar161._8_4_ = auVar121._8_4_ ^ auVar16._8_4_;
                            auVar161._12_4_ = auVar121._12_4_ ^ auVar16._12_4_;
                            auVar161._16_4_ = auVar121._16_4_ ^ auVar16._16_4_;
                            auVar161._20_4_ = auVar121._20_4_ ^ auVar16._20_4_;
                            auVar161._24_4_ = auVar121._24_4_ ^ auVar16._24_4_;
                            auVar161._28_4_ = auVar121._28_4_ ^ auVar16._28_4_;
                            auVar120 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])local_bb0.hit);
                            *(undefined1 (*) [32])(local_bb0.ray + 0x180) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_bb0.hit + 0x20));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x1a0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_bb0.hit + 0x40));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x1c0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_bb0.hit + 0x60));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x1e0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_bb0.hit + 0x80));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x200) = auVar120;
                            auVar120 = vpmaskmovd_avx2(auVar161,*(undefined1 (*) [32])
                                                                 (local_bb0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x220) = auVar120;
                            auVar120 = vpmaskmovd_avx2(auVar161,*(undefined1 (*) [32])
                                                                 (local_bb0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x240) = auVar120;
                            auVar120 = vpmaskmovd_avx2(auVar161,*(undefined1 (*) [32])
                                                                 (local_bb0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x260) = auVar120;
                            auVar120 = vpmaskmovd_avx2(auVar161,*(undefined1 (*) [32])
                                                                 (local_bb0.hit + 0x100));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x280) = auVar120;
                          }
                        }
                        auVar285 = ZEXT464((uint)fVar212);
                        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar125 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar125 >> 0x7f,0) == '\0')
                              && (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar125 >> 0xbf,0) == '\0') &&
                            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar125[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar225;
                        }
                      }
                    }
                  }
                }
                auVar275 = ZEXT464((uint)fVar227);
                bVar103 = lVar102 != 0;
                lVar102 = lVar102 + -1;
              } while ((!bVar52) && (bVar103));
              uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar126._4_4_ = uVar100;
              auVar126._0_4_ = uVar100;
              auVar126._8_4_ = uVar100;
              auVar126._12_4_ = uVar100;
              auVar126._16_4_ = uVar100;
              auVar126._20_4_ = uVar100;
              auVar126._24_4_ = uVar100;
              auVar126._28_4_ = uVar100;
              auVar125 = vcmpps_avx(_local_900,auVar126,2);
              auVar120 = vandps_avx(auVar125,local_760);
              auVar125 = local_760 & auVar125;
              uVar101 = local_7c0;
              local_760 = auVar120;
            } while ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar125 >> 0x7f,0) != '\0') ||
                       (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar125 >> 0xbf,0) != '\0') ||
                     (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar125[0x1f] < '\0');
          }
          auVar51._4_4_ = (float)local_7e0._4_4_ * (float)local_940._4_4_;
          auVar51._0_4_ = (float)local_7e0._0_4_ * (float)local_940._0_4_;
          auVar51._8_4_ = fStack_7d8 * fStack_938;
          auVar51._12_4_ = fStack_7d4 * fStack_934;
          auVar51._16_4_ = fStack_7d0 * fStack_930;
          auVar51._20_4_ = fStack_7cc * fStack_92c;
          auVar51._24_4_ = fStack_7c8 * fStack_928;
          auVar51._28_4_ = uStack_7c4;
          auVar12 = vfmadd132ps_fma(local_9a0,auVar51,_local_8e0);
          auVar12 = vfmadd132ps_fma(local_980,ZEXT1632(auVar12),_local_8c0);
          auVar70._4_4_ = uStack_95c;
          auVar70._0_4_ = local_960;
          auVar70._8_4_ = uStack_958;
          auVar70._12_4_ = uStack_954;
          auVar70._16_4_ = uStack_950;
          auVar70._20_4_ = uStack_94c;
          auVar70._24_4_ = uStack_948;
          auVar70._28_4_ = uStack_944;
          auVar120 = vandps_avx(ZEXT1632(auVar12),auVar70);
          auVar162._8_4_ = 0x3e99999a;
          auVar162._0_8_ = 0x3e99999a3e99999a;
          auVar162._12_4_ = 0x3e99999a;
          auVar162._16_4_ = 0x3e99999a;
          auVar162._20_4_ = 0x3e99999a;
          auVar162._24_4_ = 0x3e99999a;
          auVar162._28_4_ = 0x3e99999a;
          auVar120 = vcmpps_avx(auVar120,auVar162,1);
          auVar125 = vorps_avx(auVar120,local_720);
          auVar163._0_4_ = auVar14._0_4_ + (float)local_880._0_4_;
          auVar163._4_4_ = auVar14._4_4_ + (float)local_880._4_4_;
          auVar163._8_4_ = auVar14._8_4_ + fStack_878;
          auVar163._12_4_ = auVar14._12_4_ + fStack_874;
          auVar163._16_4_ = auVar14._16_4_ + fStack_870;
          auVar163._20_4_ = auVar14._20_4_ + fStack_86c;
          auVar163._24_4_ = auVar14._24_4_ + fStack_868;
          auVar163._28_4_ = auVar14._28_4_ + fStack_864;
          uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar186._4_4_ = uVar100;
          auVar186._0_4_ = uVar100;
          auVar186._8_4_ = uVar100;
          auVar186._12_4_ = uVar100;
          auVar186._16_4_ = uVar100;
          auVar186._20_4_ = uVar100;
          auVar186._24_4_ = uVar100;
          auVar186._28_4_ = uVar100;
          auVar120 = vcmpps_avx(auVar163,auVar186,2);
          local_980 = vandps_avx(auVar120,local_700);
          auVar164._8_4_ = 3;
          auVar164._0_8_ = 0x300000003;
          auVar164._12_4_ = 3;
          auVar164._16_4_ = 3;
          auVar164._20_4_ = 3;
          auVar164._24_4_ = 3;
          auVar164._28_4_ = 3;
          auVar187._8_4_ = 2;
          auVar187._0_8_ = 0x200000002;
          auVar187._12_4_ = 2;
          auVar187._16_4_ = 2;
          auVar187._20_4_ = 2;
          auVar187._24_4_ = 2;
          auVar187._28_4_ = 2;
          auVar120 = vblendvps_avx(auVar187,auVar164,auVar125);
          local_9a0 = vpcmpgtd_avx2(auVar120,local_740);
          auVar120 = vpandn_avx2(local_9a0,local_980);
          auVar125 = local_980 & ~local_9a0;
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar125 >> 0x7f,0) != '\0') ||
                (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar125 >> 0xbf,0) != '\0') ||
              (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar125[0x1f] < '\0') {
            auVar108 = vminps_avx(auVar13,auVar109);
            auVar12 = vmaxps_avx(auVar13,auVar109);
            auVar115 = vminps_avx(auVar10,auVar11);
            auVar139 = vminps_avx(auVar108,auVar115);
            auVar108 = vmaxps_avx(auVar10,auVar11);
            auVar115 = vmaxps_avx(auVar12,auVar108);
            auVar12 = vandps_avx(auVar139,local_a60);
            auVar108 = vandps_avx(auVar115,local_a60);
            auVar12 = vmaxps_avx(auVar12,auVar108);
            auVar108 = vmovshdup_avx(auVar12);
            auVar108 = vmaxss_avx(auVar108,auVar12);
            auVar12 = vshufpd_avx(auVar12,auVar12,1);
            auVar12 = vmaxss_avx(auVar12,auVar108);
            local_a20._0_4_ = auVar12._0_4_ * 1.9073486e-06;
            local_860._0_16_ = vshufps_avx(auVar115,auVar115,0xff);
            local_8a0 = _local_2c0;
            local_900._4_4_ = (float)local_2c0._4_4_ + (float)local_880._4_4_;
            local_900._0_4_ = (float)local_2c0._0_4_ + (float)local_880._0_4_;
            fStack_8f8 = fStack_2b8 + fStack_878;
            fStack_8f4 = fStack_2b4 + fStack_874;
            fStack_8f0 = fStack_2b0 + fStack_870;
            fStack_8ec = fStack_2ac + fStack_86c;
            fStack_8e8 = fStack_2a8 + fStack_868;
            fStack_8e4 = fStack_2a4 + fStack_864;
            do {
              auVar165._8_4_ = 0x7f800000;
              auVar165._0_8_ = 0x7f8000007f800000;
              auVar165._12_4_ = 0x7f800000;
              auVar165._16_4_ = 0x7f800000;
              auVar165._20_4_ = 0x7f800000;
              auVar165._24_4_ = 0x7f800000;
              auVar165._28_4_ = 0x7f800000;
              auVar125 = vblendvps_avx(auVar165,local_8a0,auVar120);
              auVar121 = vshufps_avx(auVar125,auVar125,0xb1);
              auVar121 = vminps_avx(auVar125,auVar121);
              auVar14 = vshufpd_avx(auVar121,auVar121,5);
              auVar121 = vminps_avx(auVar121,auVar14);
              auVar14 = vpermpd_avx2(auVar121,0x4e);
              auVar121 = vminps_avx(auVar121,auVar14);
              auVar121 = vcmpps_avx(auVar125,auVar121,0);
              auVar14 = auVar120 & auVar121;
              auVar125 = auVar120;
              if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar14 >> 0x7f,0) != '\0') ||
                    (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0xbf,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar14[0x1f] < '\0') {
                auVar125 = vandps_avx(auVar121,auVar120);
              }
              uVar95 = vmovmskps_avx(auVar125);
              iVar94 = 0;
              for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
                iVar94 = iVar94 + 1;
              }
              uVar96 = iVar94 << 2;
              local_780 = auVar120;
              *(undefined4 *)(local_780 + uVar96) = 0;
              uVar95 = *(uint *)(local_6a0 + uVar96);
              uVar96 = *(uint *)(local_2a0 + uVar96);
              fVar212 = auVar9._0_4_;
              if ((float)local_a70._0_4_ < 0.0) {
                fVar212 = sqrtf((float)local_a70._0_4_);
              }
              auVar285 = ZEXT464(uVar96);
              auVar275 = ZEXT464(uVar95);
              local_aa0._0_4_ = fVar212 * 1.9073486e-06;
              lVar102 = 4;
              do {
                fVar227 = auVar275._0_4_;
                fVar299 = 1.0 - fVar227;
                local_b40._0_16_ = ZEXT416((uint)fVar299);
                fVar228 = fVar299 * fVar299 * fVar299;
                fVar298 = fVar227 * fVar227;
                fVar226 = fVar227 * fVar298;
                auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar228),
                                           ZEXT416((uint)fVar226));
                fVar225 = fVar227 * fVar299;
                auVar115 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar225 * 6.0)),
                                           ZEXT416((uint)(fVar299 * fVar225)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar299 * fVar225 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar227 * fVar225)));
                auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar226),
                                          ZEXT416((uint)fVar228));
                fVar212 = (auVar12._0_4_ + auVar139._0_4_) * 0.16666667;
                fVar226 = fVar226 * 0.16666667;
                auVar146._0_4_ = fVar226 * fVar131;
                auVar146._4_4_ = fVar226 * fStack_bec;
                auVar146._8_4_ = fVar226 * fStack_be8;
                auVar146._12_4_ = fVar226 * fStack_be4;
                auVar201._4_4_ = fVar212;
                auVar201._0_4_ = fVar212;
                auVar201._8_4_ = fVar212;
                auVar201._12_4_ = fVar212;
                auVar12 = vfmadd132ps_fma(auVar201,auVar146,auVar10);
                fVar212 = (auVar108._0_4_ + auVar115._0_4_) * 0.16666667;
                auVar147._4_4_ = fVar212;
                auVar147._0_4_ = fVar212;
                auVar147._8_4_ = fVar212;
                auVar147._12_4_ = fVar212;
                auVar12 = vfmadd132ps_fma(auVar147,auVar12,auVar109);
                fVar212 = auVar285._0_4_;
                auVar176._4_4_ = fVar212;
                auVar176._0_4_ = fVar212;
                auVar176._8_4_ = fVar212;
                auVar176._12_4_ = fVar212;
                auVar108 = vfmadd213ps_fma(auVar176,local_a50,_DAT_01feba10);
                fVar228 = fVar228 * 0.16666667;
                auVar114._4_4_ = fVar228;
                auVar114._0_4_ = fVar228;
                auVar114._8_4_ = fVar228;
                auVar114._12_4_ = fVar228;
                auVar12 = vfmadd132ps_fma(auVar114,auVar12,auVar13);
                local_800._0_16_ = auVar12;
                auVar12 = vsubps_avx(auVar108,auVar12);
                _local_b20 = auVar12;
                auVar12 = vdpps_avx(auVar12,auVar12,0x7f);
                fVar226 = auVar12._0_4_;
                auVar108 = auVar275._0_16_;
                if (fVar226 < 0.0) {
                  local_b40._0_16_ = ZEXT416((uint)fVar299);
                  local_b60._0_4_ = fVar298;
                  local_b80._0_4_ = fVar225;
                  auVar275._0_4_ = sqrtf(fVar226);
                  auVar275._4_60_ = extraout_var_00;
                  auVar115 = auVar275._0_16_;
                  fVar225 = (float)local_b80._0_4_;
                  fVar298 = (float)local_b60._0_4_;
                }
                else {
                  auVar115 = vsqrtss_avx(auVar12,auVar12);
                }
                fVar228 = local_b40._0_4_;
                auVar116._4_4_ = fVar228;
                auVar116._0_4_ = fVar228;
                auVar116._8_4_ = fVar228;
                auVar116._12_4_ = fVar228;
                auVar107 = vfnmsub213ss_fma(auVar108,auVar108,ZEXT416((uint)(fVar225 * 4.0)));
                auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * 4.0)),local_b40._0_16_,
                                           local_b40._0_16_);
                fVar225 = fVar228 * -fVar228 * 0.5;
                fVar228 = auVar107._0_4_ * 0.5;
                fVar299 = auVar139._0_4_ * 0.5;
                fVar298 = fVar298 * 0.5;
                auVar236._0_4_ = fVar131 * fVar298;
                auVar236._4_4_ = fStack_bec * fVar298;
                auVar236._8_4_ = fStack_be8 * fVar298;
                auVar236._12_4_ = fStack_be4 * fVar298;
                auVar202._4_4_ = fVar299;
                auVar202._0_4_ = fVar299;
                auVar202._8_4_ = fVar299;
                auVar202._12_4_ = fVar299;
                auVar139 = vfmadd213ps_fma(auVar202,auVar10,auVar236);
                auVar218._4_4_ = fVar228;
                auVar218._0_4_ = fVar228;
                auVar218._8_4_ = fVar228;
                auVar218._12_4_ = fVar228;
                auVar139 = vfmadd213ps_fma(auVar218,auVar109,auVar139);
                auVar289._4_4_ = fVar225;
                auVar289._0_4_ = fVar225;
                auVar289._8_4_ = fVar225;
                auVar289._12_4_ = fVar225;
                auVar140 = vfmadd213ps_fma(auVar289,auVar13,auVar139);
                auVar139 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_b40._0_16_,auVar108)
                ;
                auVar108 = vfmadd231ss_fma(local_b40._0_16_,auVar108,SUB6416(ZEXT464(0xc0000000),0))
                ;
                auVar203._0_4_ = fVar131 * fVar227;
                auVar203._4_4_ = fStack_bec * fVar227;
                auVar203._8_4_ = fStack_be8 * fVar227;
                auVar203._12_4_ = fStack_be4 * fVar227;
                uVar100 = auVar108._0_4_;
                auVar219._4_4_ = uVar100;
                auVar219._0_4_ = uVar100;
                auVar219._8_4_ = uVar100;
                auVar219._12_4_ = uVar100;
                auVar108 = vfmadd213ps_fma(auVar219,auVar10,auVar203);
                auVar177._0_4_ = auVar139._0_4_;
                auVar177._4_4_ = auVar177._0_4_;
                auVar177._8_4_ = auVar177._0_4_;
                auVar177._12_4_ = auVar177._0_4_;
                auVar108 = vfmadd213ps_fma(auVar177,auVar109,auVar108);
                auVar148 = vfmadd231ps_fma(auVar108,auVar13,auVar116);
                auVar139 = vdpps_avx(auVar140,auVar140,0x7f);
                auVar108 = vblendps_avx(auVar139,_DAT_01feba10,0xe);
                auVar107 = vrsqrtss_avx(auVar108,auVar108);
                fVar225 = auVar107._0_4_;
                fVar298 = auVar139._0_4_;
                fVar225 = fVar225 * 1.5 + fVar298 * -0.5 * fVar225 * fVar225 * fVar225;
                auVar107 = vdpps_avx(auVar140,auVar148,0x7f);
                auVar178._0_4_ = auVar148._0_4_ * fVar298;
                auVar178._4_4_ = auVar148._4_4_ * fVar298;
                auVar178._8_4_ = auVar148._8_4_ * fVar298;
                auVar178._12_4_ = auVar148._12_4_ * fVar298;
                fVar228 = auVar107._0_4_;
                auVar237._0_4_ = auVar140._0_4_ * fVar228;
                auVar237._4_4_ = auVar140._4_4_ * fVar228;
                fVar299 = auVar140._8_4_;
                auVar237._8_4_ = fVar299 * fVar228;
                fVar251 = auVar140._12_4_;
                auVar237._12_4_ = fVar251 * fVar228;
                auVar107 = vsubps_avx(auVar178,auVar237);
                auVar108 = vrcpss_avx(auVar108,auVar108);
                auVar148 = vfnmadd213ss_fma(auVar108,auVar139,ZEXT416(0x40000000));
                fVar228 = auVar108._0_4_ * auVar148._0_4_;
                auVar108 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                      ZEXT416((uint)(fVar212 * (float)local_aa0._0_4_)));
                auVar245._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
                auVar245._8_4_ = -fVar299;
                auVar245._12_4_ = -fVar251;
                auVar204._0_4_ = fVar225 * auVar107._0_4_ * fVar228;
                auVar204._4_4_ = fVar225 * auVar107._4_4_ * fVar228;
                auVar204._8_4_ = fVar225 * auVar107._8_4_ * fVar228;
                auVar204._12_4_ = fVar225 * auVar107._12_4_ * fVar228;
                auVar269._0_4_ = auVar140._0_4_ * fVar225;
                auVar269._4_4_ = auVar140._4_4_ * fVar225;
                auVar269._8_4_ = fVar299 * fVar225;
                auVar269._12_4_ = fVar251 * fVar225;
                local_b40._0_16_ = auVar140;
                local_b60._0_4_ = auVar108._0_4_;
                if (fVar298 < -fVar298) {
                  local_b80._0_4_ = auVar115._0_4_;
                  local_ae0._0_16_ = auVar245;
                  local_ac0._0_16_ = auVar204;
                  fVar225 = sqrtf(fVar298);
                  auVar108 = ZEXT416((uint)local_b60._0_4_);
                  auVar115 = ZEXT416((uint)local_b80._0_4_);
                  auVar204 = local_ac0._0_16_;
                  auVar245 = local_ae0._0_16_;
                }
                else {
                  auVar139 = vsqrtss_avx(auVar139,auVar139);
                  fVar225 = auVar139._0_4_;
                }
                auVar139 = vdpps_avx(_local_b20,auVar269,0x7f);
                auVar214 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar115,auVar108);
                auVar107 = vdpps_avx(auVar245,auVar269,0x7f);
                auVar140 = vdpps_avx(_local_b20,auVar204,0x7f);
                auVar148 = vdpps_avx(local_a50,auVar269,0x7f);
                auVar214 = vfmadd213ss_fma(ZEXT416((uint)(auVar115._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_a20._0_4_ / fVar225)),
                                           auVar214);
                auVar297 = ZEXT1664(auVar214);
                fVar225 = auVar107._0_4_ + auVar140._0_4_;
                auVar117._0_4_ = auVar139._0_4_ * auVar139._0_4_;
                auVar117._4_4_ = auVar139._4_4_ * auVar139._4_4_;
                auVar117._8_4_ = auVar139._8_4_ * auVar139._8_4_;
                auVar117._12_4_ = auVar139._12_4_ * auVar139._12_4_;
                auVar115 = vdpps_avx(_local_b20,auVar245,0x7f);
                auVar140 = vsubps_avx(auVar12,auVar117);
                auVar107 = vrsqrtss_avx(auVar140,auVar140);
                fVar298 = auVar140._0_4_;
                fVar228 = auVar107._0_4_;
                fVar228 = fVar228 * 1.5 + fVar298 * -0.5 * fVar228 * fVar228 * fVar228;
                auVar107 = vdpps_avx(_local_b20,local_a50,0x7f);
                auVar115 = vfnmadd231ss_fma(auVar115,auVar139,ZEXT416((uint)fVar225));
                auVar107 = vfnmadd231ss_fma(auVar107,auVar139,auVar148);
                if (fVar298 < 0.0) {
                  local_b80._0_16_ = auVar139;
                  local_ae0._0_4_ = auVar214._0_4_;
                  local_ac0._0_16_ = auVar148;
                  local_a40._0_16_ = auVar115;
                  local_820._0_4_ = fVar228;
                  local_840._0_16_ = auVar107;
                  fVar298 = sqrtf(fVar298);
                  auVar297 = ZEXT464((uint)local_ae0._0_4_);
                  auVar108 = ZEXT416((uint)local_b60._0_4_);
                  fVar228 = (float)local_820._0_4_;
                  auVar107 = local_840._0_16_;
                  auVar139 = local_b80._0_16_;
                  auVar148 = local_ac0._0_16_;
                  auVar115 = local_a40._0_16_;
                }
                else {
                  auVar140 = vsqrtss_avx(auVar140,auVar140);
                  fVar298 = auVar140._0_4_;
                }
                auVar291 = ZEXT1664(auVar139);
                auVar250 = ZEXT1664(local_b40._0_16_);
                auVar214 = vpermilps_avx(local_800._0_16_,0xff);
                auVar140 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xff);
                auVar115 = vfmsub213ss_fma(auVar115,ZEXT416((uint)fVar228),auVar140);
                auVar205._0_8_ = auVar148._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar148._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar148._12_4_ ^ 0x80000000;
                auVar220._0_8_ = auVar115._0_8_ ^ 0x8000000080000000;
                auVar220._8_4_ = auVar115._8_4_ ^ 0x80000000;
                auVar220._12_4_ = auVar115._12_4_ ^ 0x80000000;
                auVar106 = ZEXT416((uint)(auVar107._0_4_ * fVar228));
                auVar107 = vfmsub231ss_fma(ZEXT416((uint)(auVar148._0_4_ * auVar115._0_4_)),
                                           ZEXT416((uint)fVar225),auVar106);
                auVar115 = vinsertps_avx(auVar106,auVar205,0x10);
                uVar100 = auVar107._0_4_;
                auVar206._4_4_ = uVar100;
                auVar206._0_4_ = uVar100;
                auVar206._8_4_ = uVar100;
                auVar206._12_4_ = uVar100;
                auVar115 = vdivps_avx(auVar115,auVar206);
                auVar148 = ZEXT416((uint)(fVar298 - auVar214._0_4_));
                auVar107 = vinsertps_avx(auVar139,auVar148,0x10);
                auVar179._0_4_ = auVar107._0_4_ * auVar115._0_4_;
                auVar179._4_4_ = auVar107._4_4_ * auVar115._4_4_;
                auVar179._8_4_ = auVar107._8_4_ * auVar115._8_4_;
                auVar179._12_4_ = auVar107._12_4_ * auVar115._12_4_;
                auVar115 = vinsertps_avx(auVar220,ZEXT416((uint)fVar225),0x1c);
                auVar115 = vdivps_avx(auVar115,auVar206);
                auVar207._0_4_ = auVar107._0_4_ * auVar115._0_4_;
                auVar207._4_4_ = auVar107._4_4_ * auVar115._4_4_;
                auVar207._8_4_ = auVar107._8_4_ * auVar115._8_4_;
                auVar207._12_4_ = auVar107._12_4_ * auVar115._12_4_;
                auVar115 = vhaddps_avx(auVar179,auVar179);
                auVar107 = vhaddps_avx(auVar207,auVar207);
                fVar227 = fVar227 - auVar115._0_4_;
                fVar212 = fVar212 - auVar107._0_4_;
                auVar285 = ZEXT464((uint)fVar212);
                auVar115 = vandps_avx(auVar139,local_a60);
                if (auVar297._0_4_ <= auVar115._0_4_) {
LAB_017096ab:
                  bVar52 = false;
                }
                else {
                  auVar115 = vfmadd231ss_fma(ZEXT416((uint)(auVar108._0_4_ + auVar297._0_4_)),
                                             local_860._0_16_,ZEXT416(0x36000000));
                  auVar108 = vandps_avx(auVar148,local_a60);
                  if (auVar115._0_4_ <= auVar108._0_4_) goto LAB_017096ab;
                  fVar212 = fVar212 + (float)local_9c0._0_4_;
                  auVar285 = ZEXT464((uint)fVar212);
                  bVar52 = true;
                  if ((((fVar104 <= fVar212) &&
                       (fVar225 = *(float *)(ray + k * 4 + 0x100), fVar212 <= fVar225)) &&
                      (0.0 <= fVar227)) && (fVar227 <= 1.0)) {
                    auVar12 = vrsqrtss_avx(auVar12,auVar12);
                    fVar228 = auVar12._0_4_;
                    auVar98 = (undefined1  [8])(context->scene->geometries).items[uVar93].ptr;
                    if ((((Geometry *)auVar98)->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar226 = fVar228 * 1.5 + fVar226 * -0.5 * fVar228 * fVar228 * fVar228;
                      auVar149._0_4_ = fVar226 * (float)local_b20._0_4_;
                      auVar149._4_4_ = fVar226 * (float)local_b20._4_4_;
                      auVar149._8_4_ = fVar226 * fStack_b18;
                      auVar149._12_4_ = fVar226 * fStack_b14;
                      auVar107 = vfmadd213ps_fma(auVar140,auVar149,local_b40._0_16_);
                      auVar12 = vshufps_avx(auVar149,auVar149,0xc9);
                      auVar108 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xc9);
                      auVar150._0_4_ = auVar149._0_4_ * auVar108._0_4_;
                      auVar150._4_4_ = auVar149._4_4_ * auVar108._4_4_;
                      auVar150._8_4_ = auVar149._8_4_ * auVar108._8_4_;
                      auVar150._12_4_ = auVar149._12_4_ * auVar108._12_4_;
                      auVar115 = vfmsub231ps_fma(auVar150,local_b40._0_16_,auVar12);
                      auVar12 = vshufps_avx(auVar115,auVar115,0xc9);
                      auVar108 = vshufps_avx(auVar107,auVar107,0xc9);
                      auVar115 = vshufps_avx(auVar115,auVar115,0xd2);
                      auVar118._0_4_ = auVar107._0_4_ * auVar115._0_4_;
                      auVar118._4_4_ = auVar107._4_4_ * auVar115._4_4_;
                      auVar118._8_4_ = auVar107._8_4_ * auVar115._8_4_;
                      auVar118._12_4_ = auVar107._12_4_ * auVar115._12_4_;
                      auVar12 = vfmsub231ps_fma(auVar118,auVar12,auVar108);
                      uVar100 = auVar12._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar98)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar212;
                        uVar4 = vextractps_avx(auVar12,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                        uVar4 = vextractps_avx(auVar12,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar100;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar227;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar3;
                        *(uint *)(ray + k * 4 + 0x240) = uVar93;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar7 = context->user;
                        auVar108 = vmovshdup_avx(auVar12);
                        auVar180._0_8_ = auVar108._0_8_;
                        auVar180._8_8_ = auVar180._0_8_;
                        auVar188._16_8_ = auVar180._0_8_;
                        auVar188._0_16_ = auVar180;
                        auVar188._24_8_ = auVar180._0_8_;
                        auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
                        local_3c0 = auVar12._0_8_;
                        local_3e0[0] = (RTCHitN)(char)auVar180._0_8_;
                        local_3e0[1] = (RTCHitN)SUB81(auVar180._0_8_,1);
                        local_3e0[2] = (RTCHitN)SUB81(auVar180._0_8_,2);
                        local_3e0[3] = (RTCHitN)SUB81(auVar180._0_8_,3);
                        local_3e0[4] = (RTCHitN)SUB81(auVar180._0_8_,4);
                        local_3e0[5] = (RTCHitN)SUB81(auVar180._0_8_,5);
                        local_3e0[6] = (RTCHitN)SUB81(auVar180._0_8_,6);
                        local_3e0[7] = (RTCHitN)SUB81(auVar180._0_8_,7);
                        local_3e0[8] = (RTCHitN)(char)auVar180._0_8_;
                        local_3e0[9] = (RTCHitN)SUB81(auVar180._0_8_,1);
                        local_3e0[10] = (RTCHitN)SUB81(auVar180._0_8_,2);
                        local_3e0[0xb] = (RTCHitN)SUB81(auVar180._0_8_,3);
                        local_3e0[0xc] = (RTCHitN)SUB81(auVar180._0_8_,4);
                        local_3e0[0xd] = (RTCHitN)SUB81(auVar180._0_8_,5);
                        local_3e0[0xe] = (RTCHitN)SUB81(auVar180._0_8_,6);
                        local_3e0[0xf] = (RTCHitN)SUB81(auVar180._0_8_,7);
                        local_3e0[0x10] = (RTCHitN)(char)auVar180._0_8_;
                        local_3e0[0x11] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 8);
                        local_3e0[0x12] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x10);
                        local_3e0[0x13] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x18);
                        local_3e0[0x14] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x20);
                        local_3e0[0x15] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x28);
                        local_3e0[0x16] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x30);
                        local_3e0[0x17] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x38);
                        local_3e0[0x18] = (RTCHitN)(char)auVar180._0_8_;
                        local_3e0[0x19] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 8);
                        local_3e0[0x1a] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x10);
                        local_3e0[0x1b] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x18);
                        local_3e0[0x1c] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x20);
                        local_3e0[0x1d] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x28);
                        local_3e0[0x1e] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x30);
                        local_3e0[0x1f] = (RTCHitN)(char)((ulong)auVar180._0_8_ >> 0x38);
                        uStack_3b8 = local_3c0;
                        uStack_3b0 = local_3c0;
                        uStack_3a8 = local_3c0;
                        local_3a0 = uVar100;
                        uStack_39c = uVar100;
                        uStack_398 = uVar100;
                        uStack_394 = uVar100;
                        uStack_390 = uVar100;
                        uStack_38c = uVar100;
                        uStack_388 = uVar100;
                        uStack_384 = uVar100;
                        local_380 = fVar227;
                        fStack_37c = fVar227;
                        fStack_378 = fVar227;
                        fStack_374 = fVar227;
                        fStack_370 = fVar227;
                        fStack_36c = fVar227;
                        fStack_368 = fVar227;
                        fStack_364 = fVar227;
                        auVar151._12_4_ = 0;
                        auVar151._0_12_ = ZEXT412(0);
                        auVar151 = auVar151 << 0x20;
                        local_360 = ZEXT1232(ZEXT412(0)) << 0x20;
                        local_340 = CONCAT44(uStack_5fc,local_600);
                        uStack_338 = CONCAT44(uStack_5f4,uStack_5f8);
                        uStack_330 = CONCAT44(uStack_5ec,uStack_5f0);
                        uStack_328 = CONCAT44(uStack_5e4,uStack_5e8);
                        local_320._4_4_ = uStack_5dc;
                        local_320._0_4_ = local_5e0;
                        local_320._8_4_ = uStack_5d8;
                        local_320._12_4_ = uStack_5d4;
                        local_320._16_4_ = uStack_5d0;
                        local_320._20_4_ = uStack_5cc;
                        local_320._24_4_ = uStack_5c8;
                        local_320._28_4_ = uStack_5c4;
                        auVar120 = vpcmpeqd_avx2(local_320,local_320);
                        local_ae8[1] = auVar120;
                        *local_ae8 = auVar120;
                        local_300 = pRVar7->instID[0];
                        uStack_2fc = local_300;
                        uStack_2f8 = local_300;
                        uStack_2f4 = local_300;
                        uStack_2f0 = local_300;
                        uStack_2ec = local_300;
                        uStack_2e8 = local_300;
                        uStack_2e4 = local_300;
                        local_2e0 = pRVar7->instPrimID[0];
                        uStack_2dc = local_2e0;
                        uStack_2d8 = local_2e0;
                        uStack_2d4 = local_2e0;
                        uStack_2d0 = local_2e0;
                        uStack_2cc = local_2e0;
                        uStack_2c8 = local_2e0;
                        uStack_2c4 = local_2e0;
                        *(float *)(ray + k * 4 + 0x100) = fVar212;
                        local_a00 = local_640._0_8_;
                        uStack_9f8 = local_640._8_8_;
                        uStack_9f0 = local_640._16_8_;
                        uStack_9e8 = local_640._24_8_;
                        local_bb0.valid = (int *)&local_a00;
                        local_bb0.geometryUserPtr = ((Geometry *)auVar98)->userPtr;
                        local_bb0.context = context->user;
                        local_bb0.hit = local_3e0;
                        local_bb0.N = 8;
                        local_bb0.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar98)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_b20 = auVar98;
                          auVar188 = ZEXT1632(auVar180);
                          auVar250 = ZEXT1664(local_b40._0_16_);
                          auVar291 = ZEXT1664(auVar139);
                          auVar297 = ZEXT1664(auVar297._0_16_);
                          (*((Geometry *)auVar98)->intersectionFilterN)(&local_bb0);
                          auVar151 = ZEXT816(0) << 0x40;
                          auVar98 = local_b20;
                        }
                        auVar120 = ZEXT1632(auVar151);
                        auVar62._8_8_ = uStack_9f8;
                        auVar62._0_8_ = local_a00;
                        auVar62._16_8_ = uStack_9f0;
                        auVar62._24_8_ = uStack_9e8;
                        auVar125 = vpcmpeqd_avx2(auVar120,auVar62);
                        auVar121 = vpcmpeqd_avx2(auVar120,auVar120);
                        auVar120 = auVar121 & ~auVar125;
                        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar120 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar120 >> 0x7f,0) == '\0')
                              && (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar120 >> 0xbf,0) == '\0') &&
                            (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar120[0x1f]) {
                          auVar125 = auVar125 ^ auVar121;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar98)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar188 = ZEXT1632(auVar188._0_16_);
                            auVar250 = ZEXT1664(auVar250._0_16_);
                            auVar291 = ZEXT1664(auVar291._0_16_);
                            auVar297 = ZEXT1664(auVar297._0_16_);
                            (*p_Var6)(&local_bb0);
                          }
                          auVar63._8_8_ = uStack_9f8;
                          auVar63._0_8_ = local_a00;
                          auVar63._16_8_ = uStack_9f0;
                          auVar63._24_8_ = uStack_9e8;
                          auVar121 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar63);
                          auVar14 = vpcmpeqd_avx2(auVar188,auVar188);
                          auVar125 = auVar121 ^ auVar14;
                          auVar120 = auVar14 & ~auVar121;
                          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar120 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar120 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar120 >> 0x7f,0) != '\0') ||
                                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar120 >> 0xbf,0) != '\0') ||
                              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar120[0x1f] < '\0') {
                            auVar166._0_4_ = auVar121._0_4_ ^ auVar14._0_4_;
                            auVar166._4_4_ = auVar121._4_4_ ^ auVar14._4_4_;
                            auVar166._8_4_ = auVar121._8_4_ ^ auVar14._8_4_;
                            auVar166._12_4_ = auVar121._12_4_ ^ auVar14._12_4_;
                            auVar166._16_4_ = auVar121._16_4_ ^ auVar14._16_4_;
                            auVar166._20_4_ = auVar121._20_4_ ^ auVar14._20_4_;
                            auVar166._24_4_ = auVar121._24_4_ ^ auVar14._24_4_;
                            auVar166._28_4_ = auVar121._28_4_ ^ auVar14._28_4_;
                            auVar120 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])local_bb0.hit);
                            *(undefined1 (*) [32])(local_bb0.ray + 0x180) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                                (local_bb0.hit + 0x20));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x1a0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                                (local_bb0.hit + 0x40));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x1c0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                                (local_bb0.hit + 0x60));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x1e0) = auVar120;
                            auVar120 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])
                                                                (local_bb0.hit + 0x80));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x200) = auVar120;
                            auVar120 = vpmaskmovd_avx2(auVar166,*(undefined1 (*) [32])
                                                                 (local_bb0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x220) = auVar120;
                            auVar120 = vpmaskmovd_avx2(auVar166,*(undefined1 (*) [32])
                                                                 (local_bb0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x240) = auVar120;
                            auVar120 = vpmaskmovd_avx2(auVar166,*(undefined1 (*) [32])
                                                                 (local_bb0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x260) = auVar120;
                            auVar120 = vpmaskmovd_avx2(auVar166,*(undefined1 (*) [32])
                                                                 (local_bb0.hit + 0x100));
                            *(undefined1 (*) [32])(local_bb0.ray + 0x280) = auVar120;
                          }
                        }
                        auVar285 = ZEXT464((uint)fVar212);
                        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar125 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar125 >> 0x7f,0) == '\0')
                              && (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar125 >> 0xbf,0) == '\0') &&
                            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar125[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar225;
                        }
                      }
                    }
                  }
                }
                auVar275 = ZEXT464((uint)fVar227);
                bVar103 = lVar102 != 0;
                lVar102 = lVar102 + -1;
              } while ((!bVar52) && (bVar103));
              uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar127._4_4_ = uVar100;
              auVar127._0_4_ = uVar100;
              auVar127._8_4_ = uVar100;
              auVar127._12_4_ = uVar100;
              auVar127._16_4_ = uVar100;
              auVar127._20_4_ = uVar100;
              auVar127._24_4_ = uVar100;
              auVar127._28_4_ = uVar100;
              auVar125 = vcmpps_avx(_local_900,auVar127,2);
              auVar120 = vandps_avx(auVar125,local_780);
              local_780 = local_780 & auVar125;
              uVar101 = local_7c0;
            } while ((((((((local_780 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_780 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_780 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_780 >> 0x7f,0) != '\0') ||
                       (local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_780 >> 0xbf,0) != '\0') ||
                     (local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_780[0x1f] < '\0');
          }
          auVar167._0_4_ = (float)local_880._0_4_ + local_420._0_4_;
          auVar167._4_4_ = (float)local_880._4_4_ + local_420._4_4_;
          auVar167._8_4_ = fStack_878 + local_420._8_4_;
          auVar167._12_4_ = fStack_874 + local_420._12_4_;
          auVar167._16_4_ = fStack_870 + local_420._16_4_;
          auVar167._20_4_ = fStack_86c + local_420._20_4_;
          auVar167._24_4_ = fStack_868 + local_420._24_4_;
          auVar167._28_4_ = fStack_864 + local_420._28_4_;
          uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar210._4_4_ = uVar100;
          auVar210._0_4_ = uVar100;
          auVar210._8_4_ = uVar100;
          auVar210._12_4_ = uVar100;
          auVar210._16_4_ = uVar100;
          auVar210._20_4_ = uVar100;
          auVar210._24_4_ = uVar100;
          auVar210._28_4_ = uVar100;
          auVar125 = vcmpps_avx(auVar167,auVar210,2);
          auVar120 = vandps_avx(local_6e0,local_6c0);
          auVar120 = vandps_avx(auVar125,auVar120);
          auVar222._0_4_ = (float)local_880._0_4_ + local_2c0._0_4_;
          auVar222._4_4_ = (float)local_880._4_4_ + local_2c0._4_4_;
          auVar222._8_4_ = fStack_878 + local_2c0._8_4_;
          auVar222._12_4_ = fStack_874 + local_2c0._12_4_;
          auVar222._16_4_ = fStack_870 + local_2c0._16_4_;
          auVar222._20_4_ = fStack_86c + local_2c0._20_4_;
          auVar222._24_4_ = fStack_868 + local_2c0._24_4_;
          auVar222._28_4_ = fStack_864 + local_2c0._28_4_;
          auVar121 = vcmpps_avx(auVar222,auVar210,2);
          auVar125 = vandps_avx(local_9a0,local_980);
          auVar224 = ZEXT3264(auVar125);
          auVar125 = vandps_avx(auVar121,auVar125);
          auVar125 = vorps_avx(auVar120,auVar125);
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar125 >> 0x7f,0) != '\0') ||
                (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar125 >> 0xbf,0) != '\0') ||
              (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar125[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar99 * 0x60) = auVar125;
            auVar120 = vblendvps_avx(_local_2c0,local_420,auVar120);
            *(undefined1 (*) [32])(auStack_160 + uVar99 * 0x60) = auVar120;
            auVar65._8_8_ = uStack_9c8;
            auVar65._0_8_ = local_9d0;
            uVar1 = vmovlps_avx(auVar65);
            *(undefined8 *)(afStack_140 + uVar99 * 0x18) = uVar1;
            auStack_138[uVar99 * 0x18] = (int)uVar101 + 1;
            uVar99 = (ulong)((int)uVar99 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar99 == 0) {
        uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar119._4_4_ = uVar100;
        auVar119._0_4_ = uVar100;
        auVar119._8_4_ = uVar100;
        auVar119._12_4_ = uVar100;
        auVar8 = vcmpps_avx(local_650,auVar119,2);
        uVar93 = vmovmskps_avx(auVar8);
        uVar93 = (uint)local_9a8 & uVar93;
        if (uVar93 == 0) {
          return;
        }
        goto LAB_0170722b;
      }
      uVar97 = (ulong)((int)uVar99 - 1);
      lVar102 = uVar97 * 0x60;
      auVar120 = *(undefined1 (*) [32])(auStack_160 + lVar102);
      auVar128._0_4_ = auVar120._0_4_ + (float)local_880._0_4_;
      auVar128._4_4_ = auVar120._4_4_ + (float)local_880._4_4_;
      auVar128._8_4_ = auVar120._8_4_ + fStack_878;
      auVar128._12_4_ = auVar120._12_4_ + fStack_874;
      auVar128._16_4_ = auVar120._16_4_ + fStack_870;
      auVar128._20_4_ = auVar120._20_4_ + fStack_86c;
      auVar128._24_4_ = auVar120._24_4_ + fStack_868;
      auVar128._28_4_ = auVar120._28_4_ + fStack_864;
      uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar211._4_4_ = uVar100;
      auVar211._0_4_ = uVar100;
      auVar211._8_4_ = uVar100;
      auVar211._12_4_ = uVar100;
      auVar211._16_4_ = uVar100;
      auVar211._20_4_ = uVar100;
      auVar211._24_4_ = uVar100;
      auVar211._28_4_ = uVar100;
      auVar121 = vcmpps_avx(auVar128,auVar211,2);
      auVar125 = vandps_avx(auVar121,*(undefined1 (*) [32])(auStack_180 + lVar102));
      local_3e0[0] = (RTCHitN)auVar125[0];
      local_3e0[1] = (RTCHitN)auVar125[1];
      local_3e0[2] = (RTCHitN)auVar125[2];
      local_3e0[3] = (RTCHitN)auVar125[3];
      local_3e0[4] = (RTCHitN)auVar125[4];
      local_3e0[5] = (RTCHitN)auVar125[5];
      local_3e0[6] = (RTCHitN)auVar125[6];
      local_3e0[7] = (RTCHitN)auVar125[7];
      local_3e0[8] = (RTCHitN)auVar125[8];
      local_3e0[9] = (RTCHitN)auVar125[9];
      local_3e0[10] = (RTCHitN)auVar125[10];
      local_3e0[0xb] = (RTCHitN)auVar125[0xb];
      local_3e0[0xc] = (RTCHitN)auVar125[0xc];
      local_3e0[0xd] = (RTCHitN)auVar125[0xd];
      local_3e0[0xe] = (RTCHitN)auVar125[0xe];
      local_3e0[0xf] = (RTCHitN)auVar125[0xf];
      local_3e0[0x10] = (RTCHitN)auVar125[0x10];
      local_3e0[0x11] = (RTCHitN)auVar125[0x11];
      local_3e0[0x12] = (RTCHitN)auVar125[0x12];
      local_3e0[0x13] = (RTCHitN)auVar125[0x13];
      local_3e0[0x14] = (RTCHitN)auVar125[0x14];
      local_3e0[0x15] = (RTCHitN)auVar125[0x15];
      local_3e0[0x16] = (RTCHitN)auVar125[0x16];
      local_3e0[0x17] = (RTCHitN)auVar125[0x17];
      local_3e0[0x18] = (RTCHitN)auVar125[0x18];
      local_3e0[0x19] = (RTCHitN)auVar125[0x19];
      local_3e0[0x1a] = (RTCHitN)auVar125[0x1a];
      local_3e0[0x1b] = (RTCHitN)auVar125[0x1b];
      local_3e0[0x1c] = (RTCHitN)auVar125[0x1c];
      local_3e0[0x1d] = (RTCHitN)auVar125[0x1d];
      local_3e0[0x1e] = (RTCHitN)auVar125[0x1e];
      local_3e0[0x1f] = (RTCHitN)auVar125[0x1f];
      auVar121 = *(undefined1 (*) [32])(auStack_180 + lVar102) & auVar121;
      bVar58 = (auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar59 = (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar57 = (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar56 = SUB321(auVar121 >> 0x7f,0) == '\0';
      bVar55 = (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar54 = SUB321(auVar121 >> 0xbf,0) == '\0';
      bVar103 = (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar52 = -1 < auVar121[0x1f];
      if (((((((!bVar58 || !bVar59) || !bVar57) || !bVar56) || !bVar55) || !bVar54) || !bVar103) ||
          !bVar52) {
        auVar189._8_4_ = 0x7f800000;
        auVar189._0_8_ = 0x7f8000007f800000;
        auVar189._12_4_ = 0x7f800000;
        auVar189._16_4_ = 0x7f800000;
        auVar189._20_4_ = 0x7f800000;
        auVar189._24_4_ = 0x7f800000;
        auVar189._28_4_ = 0x7f800000;
        auVar120 = vblendvps_avx(auVar189,auVar120,auVar125);
        auVar121 = vshufps_avx(auVar120,auVar120,0xb1);
        auVar121 = vminps_avx(auVar120,auVar121);
        auVar14 = vshufpd_avx(auVar121,auVar121,5);
        auVar121 = vminps_avx(auVar121,auVar14);
        auVar14 = vpermpd_avx2(auVar121,0x4e);
        auVar121 = vminps_avx(auVar121,auVar14);
        auVar120 = vcmpps_avx(auVar120,auVar121,0);
        auVar121 = auVar125 & auVar120;
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          auVar125 = vandps_avx(auVar120,auVar125);
        }
        fVar212 = afStack_140[uVar97 * 0x18 + 1];
        uVar101 = (ulong)auStack_138[uVar97 * 0x18];
        uVar95 = vmovmskps_avx(auVar125);
        iVar94 = 0;
        for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
          iVar94 = iVar94 + 1;
        }
        fVar225 = afStack_140[uVar97 * 0x18];
        auVar129._4_4_ = fVar225;
        auVar129._0_4_ = fVar225;
        auVar129._8_4_ = fVar225;
        auVar129._12_4_ = fVar225;
        auVar129._16_4_ = fVar225;
        auVar129._20_4_ = fVar225;
        auVar129._24_4_ = fVar225;
        auVar129._28_4_ = fVar225;
        *(undefined4 *)(local_3e0 + (uint)(iVar94 << 2)) = 0;
        *(RTCHitN (*) [32])(auStack_180 + lVar102) = local_3e0;
        if (((((((((undefined1  [32])local_3e0 >> 0x1f & (undefined1  [32])0x1) !=
                  (undefined1  [32])0x0 ||
                 ((undefined1  [32])local_3e0 >> 0x3f & (undefined1  [32])0x1) !=
                 (undefined1  [32])0x0) ||
                ((undefined1  [32])local_3e0 >> 0x5f & (undefined1  [32])0x1) !=
                (undefined1  [32])0x0) || SUB321((undefined1  [32])local_3e0 >> 0x7f,0) != '\0') ||
              ((undefined1  [32])local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
              ) || SUB321((undefined1  [32])local_3e0 >> 0xbf,0) != '\0') ||
            ((undefined1  [32])local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
            || local_3e0[0x1f] < '\0') {
          uVar97 = uVar99;
        }
        fVar212 = fVar212 - fVar225;
        auVar168._4_4_ = fVar212;
        auVar168._0_4_ = fVar212;
        auVar168._8_4_ = fVar212;
        auVar168._12_4_ = fVar212;
        auVar168._16_4_ = fVar212;
        auVar168._20_4_ = fVar212;
        auVar168._24_4_ = fVar212;
        auVar168._28_4_ = fVar212;
        auVar12 = vfmadd132ps_fma(auVar168,auVar129,_DAT_02020f20);
        local_420 = ZEXT1632(auVar12);
        local_9d0 = *(undefined8 *)(local_420 + (uint)(iVar94 << 2));
        uStack_9c8 = 0;
      }
      uVar99 = uVar97;
    } while (((((((bVar58 && bVar59) && bVar57) && bVar56) && bVar55) && bVar54) && bVar103) &&
             bVar52);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }